

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  ulong uVar27;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  byte bVar70;
  ulong uVar71;
  uint uVar72;
  uint uVar73;
  long lVar74;
  long lVar75;
  Geometry *pGVar76;
  undefined8 unaff_R13;
  ulong uVar77;
  ulong uVar78;
  long lVar79;
  size_t sVar80;
  byte bVar81;
  float fVar82;
  float fVar83;
  float fVar139;
  float fVar141;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar95 [16];
  float fVar140;
  float fVar142;
  float fVar143;
  float fVar144;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar145;
  float fVar146;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined4 uVar147;
  float fVar162;
  float fVar163;
  vint4 bi_2;
  float fVar164;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vint4 bi_1;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  float fVar168;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar176;
  float fVar177;
  float fVar190;
  vint4 ai_2;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [64];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar208 [64];
  vint4 ai_1;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [64];
  undefined1 auVar214 [64];
  undefined1 auVar215 [16];
  undefined1 auVar216 [64];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  RTCFilterFunctionNArguments args;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  RTCFilterFunctionNArguments local_670;
  undefined1 local_640 [16];
  size_t local_630;
  undefined1 (*local_628) [32];
  undefined1 local_620 [32];
  long local_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined4 local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  undefined4 uStack_510;
  undefined4 uStack_50c;
  undefined4 uStack_508;
  undefined4 uStack_504;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined4 uStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined4 local_3a0;
  int local_39c;
  undefined1 local_390 [16];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_340 [4];
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  int local_240;
  int iStack_23c;
  int iStack_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int iStack_228;
  int iStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  uint local_160;
  uint uStack_15c;
  uint uStack_158;
  uint uStack_154;
  uint uStack_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  
  uVar71 = (ulong)(byte)prim[1];
  fVar168 = *(float *)(prim + uVar71 * 0x19 + 0x12);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar88 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar87 = vsubps_avx(auVar87,*(undefined1 (*) [16])(prim + uVar71 * 0x19 + 6));
  auVar178._0_4_ = fVar168 * auVar87._0_4_;
  auVar178._4_4_ = fVar168 * auVar87._4_4_;
  auVar178._8_4_ = fVar168 * auVar87._8_4_;
  auVar178._12_4_ = fVar168 * auVar87._12_4_;
  auVar91._0_4_ = fVar168 * auVar88._0_4_;
  auVar91._4_4_ = fVar168 * auVar88._4_4_;
  auVar91._8_4_ = fVar168 * auVar88._8_4_;
  auVar91._12_4_ = fVar168 * auVar88._12_4_;
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar84 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xb + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xc + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar85 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xd + 6)));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x12 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x13 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x14 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar222._4_4_ = auVar91._0_4_;
  auVar222._0_4_ = auVar91._0_4_;
  auVar222._8_4_ = auVar91._0_4_;
  auVar222._12_4_ = auVar91._0_4_;
  auVar94 = vshufps_avx(auVar91,auVar91,0x55);
  auVar89 = vshufps_avx(auVar91,auVar91,0xaa);
  fVar168 = auVar89._0_4_;
  auVar191._0_4_ = fVar168 * auVar84._0_4_;
  fVar162 = auVar89._4_4_;
  auVar191._4_4_ = fVar162 * auVar84._4_4_;
  fVar163 = auVar89._8_4_;
  auVar191._8_4_ = fVar163 * auVar84._8_4_;
  fVar164 = auVar89._12_4_;
  auVar191._12_4_ = fVar164 * auVar84._12_4_;
  auVar92._0_4_ = auVar85._0_4_ * fVar168;
  auVar92._4_4_ = auVar85._4_4_ * fVar162;
  auVar92._8_4_ = auVar85._8_4_ * fVar163;
  auVar92._12_4_ = auVar85._12_4_ * fVar164;
  auVar148._0_4_ = auVar86._0_4_ * fVar168;
  auVar148._4_4_ = auVar86._4_4_ * fVar162;
  auVar148._8_4_ = auVar86._8_4_ * fVar163;
  auVar148._12_4_ = auVar86._12_4_ * fVar164;
  auVar89 = vfmadd231ps_fma(auVar191,auVar94,auVar88);
  auVar90 = vfmadd231ps_fma(auVar92,auVar94,auVar21);
  auVar94 = vfmadd231ps_fma(auVar148,auVar23,auVar94);
  auVar93 = vfmadd231ps_fma(auVar89,auVar222,auVar87);
  auVar90 = vfmadd231ps_fma(auVar90,auVar222,auVar20);
  auVar91 = vfmadd231ps_fma(auVar94,auVar22,auVar222);
  auVar223._4_4_ = auVar178._0_4_;
  auVar223._0_4_ = auVar178._0_4_;
  auVar223._8_4_ = auVar178._0_4_;
  auVar223._12_4_ = auVar178._0_4_;
  auVar94 = vshufps_avx(auVar178,auVar178,0x55);
  auVar89 = vshufps_avx(auVar178,auVar178,0xaa);
  auVar84 = vmulps_avx512vl(auVar89,auVar84);
  auVar179._0_4_ = auVar89._0_4_ * auVar85._0_4_;
  auVar179._4_4_ = auVar89._4_4_ * auVar85._4_4_;
  auVar179._8_4_ = auVar89._8_4_ * auVar85._8_4_;
  auVar179._12_4_ = auVar89._12_4_ * auVar85._12_4_;
  auVar95._0_4_ = auVar89._0_4_ * auVar86._0_4_;
  auVar95._4_4_ = auVar89._4_4_ * auVar86._4_4_;
  auVar95._8_4_ = auVar89._8_4_ * auVar86._8_4_;
  auVar95._12_4_ = auVar89._12_4_ * auVar86._12_4_;
  auVar85 = vfmadd231ps_avx512vl(auVar84,auVar94,auVar88);
  auVar88 = vfmadd231ps_fma(auVar179,auVar94,auVar21);
  auVar84 = vfmadd231ps_fma(auVar95,auVar94,auVar23);
  auVar86 = vfmadd231ps_avx512vl(auVar85,auVar223,auVar87);
  auVar85 = vfmadd231ps_fma(auVar88,auVar223,auVar20);
  auVar23 = vfmadd231ps_fma(auVar84,auVar223,auVar22);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar87);
  auVar88 = vandps_avx512vl(auVar93,auVar87);
  auVar209._8_4_ = 0x219392ef;
  auVar209._0_8_ = 0x219392ef219392ef;
  auVar209._12_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar88,auVar209,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar89._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._12_4_;
  auVar88 = vandps_avx512vl(auVar90,auVar87);
  uVar77 = vcmpps_avx512vl(auVar88,auVar209,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar93._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar90._12_4_;
  auVar87 = vandps_avx512vl(auVar91,auVar87);
  uVar77 = vcmpps_avx512vl(auVar87,auVar209,1);
  bVar13 = (bool)((byte)uVar77 & 1);
  auVar90._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._0_4_;
  bVar13 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._4_4_;
  bVar13 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._8_4_;
  bVar13 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar91._12_4_;
  auVar88 = vrcp14ps_avx512vl(auVar89);
  auVar210._8_4_ = 0x3f800000;
  auVar210._0_8_ = 0x3f8000003f800000;
  auVar210._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar89,auVar88,auVar210);
  auVar84 = vfmadd132ps_fma(auVar87,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar93);
  auVar87 = vfnmadd213ps_fma(auVar93,auVar88,auVar210);
  auVar21 = vfmadd132ps_fma(auVar87,auVar88,auVar88);
  auVar88 = vrcp14ps_avx512vl(auVar90);
  auVar87 = vfnmadd213ps_fma(auVar90,auVar88,auVar210);
  auVar22 = vfmadd132ps_fma(auVar87,auVar88,auVar88);
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx512vl(auVar87,auVar86);
  auVar199._0_4_ = auVar84._0_4_ * auVar87._0_4_;
  auVar199._4_4_ = auVar84._4_4_ * auVar87._4_4_;
  auVar199._8_4_ = auVar84._8_4_ * auVar87._8_4_;
  auVar199._12_4_ = auVar84._12_4_ * auVar87._12_4_;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar87 = vpmovsxwd_avx(auVar88);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx512vl(auVar87,auVar86);
  auVar192._0_4_ = auVar84._0_4_ * auVar87._0_4_;
  auVar192._4_4_ = auVar84._4_4_ * auVar87._4_4_;
  auVar192._8_4_ = auVar84._8_4_ * auVar87._8_4_;
  auVar192._12_4_ = auVar84._12_4_ * auVar87._12_4_;
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar71 * 0xe + 6);
  auVar87 = vpmovsxwd_avx(auVar84);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vsubps_avx(auVar87,auVar85);
  auVar84 = vpbroadcastd_avx512vl();
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar87 = vpmovsxwd_avx(auVar20);
  auVar211._0_4_ = auVar21._0_4_ * auVar88._0_4_;
  auVar211._4_4_ = auVar21._4_4_ * auVar88._4_4_;
  auVar211._8_4_ = auVar21._8_4_ * auVar88._8_4_;
  auVar211._12_4_ = auVar21._12_4_ * auVar88._12_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar85);
  auVar165._0_4_ = auVar21._0_4_ * auVar87._0_4_;
  auVar165._4_4_ = auVar21._4_4_ * auVar87._4_4_;
  auVar165._8_4_ = auVar21._8_4_ * auVar87._8_4_;
  auVar165._12_4_ = auVar21._12_4_ * auVar87._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar71 * 0x15 + 6);
  auVar87 = vpmovsxwd_avx(auVar21);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar23);
  auVar180._0_4_ = auVar22._0_4_ * auVar87._0_4_;
  auVar180._4_4_ = auVar22._4_4_ * auVar87._4_4_;
  auVar180._8_4_ = auVar22._8_4_ * auVar87._8_4_;
  auVar180._12_4_ = auVar22._12_4_ * auVar87._12_4_;
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar71 * 0x17 + 6);
  auVar87 = vpmovsxwd_avx(auVar85);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar87 = vsubps_avx(auVar87,auVar23);
  auVar149._0_4_ = auVar22._0_4_ * auVar87._0_4_;
  auVar149._4_4_ = auVar22._4_4_ * auVar87._4_4_;
  auVar149._8_4_ = auVar22._8_4_ * auVar87._8_4_;
  auVar149._12_4_ = auVar22._12_4_ * auVar87._12_4_;
  auVar87 = vpminsd_avx(auVar199,auVar192);
  auVar88 = vpminsd_avx(auVar211,auVar165);
  auVar87 = vmaxps_avx(auVar87,auVar88);
  auVar88 = vpminsd_avx(auVar180,auVar149);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar22._4_4_ = uVar147;
  auVar22._0_4_ = uVar147;
  auVar22._8_4_ = uVar147;
  auVar22._12_4_ = uVar147;
  auVar88 = vmaxps_avx512vl(auVar88,auVar22);
  auVar87 = vmaxps_avx(auVar87,auVar88);
  auVar23._8_4_ = 0x3f7ffffa;
  auVar23._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar23._12_4_ = 0x3f7ffffa;
  local_2d0 = vmulps_avx512vl(auVar87,auVar23);
  auVar87 = vpmaxsd_avx(auVar199,auVar192);
  auVar88 = vpmaxsd_avx(auVar211,auVar165);
  auVar87 = vminps_avx(auVar87,auVar88);
  auVar88 = vpmaxsd_avx(auVar180,auVar149);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar86._4_4_ = uVar147;
  auVar86._0_4_ = uVar147;
  auVar86._8_4_ = uVar147;
  auVar86._12_4_ = uVar147;
  auVar88 = vminps_avx512vl(auVar88,auVar86);
  auVar87 = vminps_avx(auVar87,auVar88);
  auVar94._8_4_ = 0x3f800003;
  auVar94._0_8_ = 0x3f8000033f800003;
  auVar94._12_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar94);
  uVar24 = vcmpps_avx512vl(local_2d0,auVar87,2);
  uVar28 = vpcmpgtd_avx512vl(auVar84,_DAT_01f4ad30);
  uVar77 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar24 & 0xf & (byte)uVar28));
  local_628 = (undefined1 (*) [32])&local_160;
  local_2c0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  sVar80 = k;
  local_630 = k;
  do {
    if (uVar77 == 0) {
      return;
    }
    lVar74 = 0;
    for (uVar71 = uVar77; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      lVar74 = lVar74 + 1;
    }
    uVar8 = *(uint *)(prim + 2);
    uVar9 = *(uint *)(prim + lVar74 * 4 + 6);
    pGVar76 = (context->scene->geometries).items[uVar8].ptr;
    uVar71 = (ulong)*(uint *)(*(long *)&pGVar76->field_0x58 +
                             pGVar76[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i * (ulong)uVar9);
    p_Var12 = pGVar76[1].intersectionFilterN;
    lVar74 = *(long *)&pGVar76[1].time_range.upper;
    auVar87 = *(undefined1 (*) [16])(lVar74 + (long)p_Var12 * uVar71);
    pauVar3 = (undefined1 (*) [16])(lVar74 + (uVar71 + 1) * (long)p_Var12);
    uVar24 = *(undefined8 *)*pauVar3;
    uVar28 = *(undefined8 *)(*pauVar3 + 8);
    auVar86 = *pauVar3;
    auVar22 = *pauVar3;
    auVar21 = *pauVar3;
    auVar88 = *pauVar3;
    pauVar4 = (undefined1 (*) [16])(lVar74 + (uVar71 + 2) * (long)p_Var12);
    uVar63 = *(undefined8 *)*pauVar4;
    uVar64 = *(undefined8 *)(*pauVar4 + 8);
    auVar23 = *pauVar4;
    auVar85 = *pauVar4;
    auVar20 = *pauVar4;
    auVar84 = *pauVar4;
    uVar77 = uVar77 - 1 & uVar77;
    pauVar5 = (undefined1 (*) [12])(lVar74 + (uVar71 + 3) * (long)p_Var12);
    uVar65 = *(undefined8 *)*pauVar5;
    uVar66 = *(undefined8 *)(*pauVar5 + 8);
    local_6d0 = (float)uVar65;
    fStack_6cc = (float)((ulong)uVar65 >> 0x20);
    fStack_6c8 = (float)uVar66;
    fStack_6c4 = (float)((ulong)uVar66 >> 0x20);
    if (uVar77 != 0) {
      uVar78 = uVar77 - 1 & uVar77;
      for (uVar71 = uVar77; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
      }
      if (uVar78 != 0) {
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x8000000000000000) {
        }
      }
    }
    iVar10 = (int)pGVar76[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + sVar80 * 4)),
                            ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x20)),0x1c);
    auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x40)),0x28);
    auVar90 = vsubps_avx(auVar87,auVar94);
    uVar147 = auVar90._0_4_;
    auVar169._4_4_ = uVar147;
    auVar169._0_4_ = uVar147;
    auVar169._8_4_ = uVar147;
    auVar169._12_4_ = uVar147;
    auVar89 = vshufps_avx(auVar90,auVar90,0x55);
    aVar6 = pre->ray_space[k].vx.field_0;
    aVar7 = pre->ray_space[k].vy.field_0;
    auVar90 = vshufps_avx(auVar90,auVar90,0xaa);
    fVar168 = pre->ray_space[k].vz.field_0.m128[0];
    fVar162 = pre->ray_space[k].vz.field_0.m128[1];
    fVar163 = pre->ray_space[k].vz.field_0.m128[2];
    fVar164 = pre->ray_space[k].vz.field_0.m128[3];
    auVar215._0_4_ = fVar168 * auVar90._0_4_;
    auVar215._4_4_ = fVar162 * auVar90._4_4_;
    auVar215._8_4_ = fVar163 * auVar90._8_4_;
    auVar215._12_4_ = fVar164 * auVar90._12_4_;
    auVar89 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar89);
    auVar148 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar6,auVar169);
    auVar89 = vshufps_avx(auVar87,auVar87,0xff);
    auVar93 = vsubps_avx(auVar88,auVar94);
    uVar147 = auVar93._0_4_;
    auVar181._4_4_ = uVar147;
    auVar181._0_4_ = uVar147;
    auVar181._8_4_ = uVar147;
    auVar181._12_4_ = uVar147;
    auVar90 = vshufps_avx(auVar93,auVar93,0x55);
    auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar217._0_4_ = fVar168 * auVar93._0_4_;
    auVar217._4_4_ = fVar162 * auVar93._4_4_;
    auVar217._8_4_ = fVar163 * auVar93._8_4_;
    auVar217._12_4_ = fVar164 * auVar93._12_4_;
    auVar90 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar7,auVar90);
    auVar149 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar6,auVar181);
    auVar90 = vshufps_avx(auVar88,auVar88,0xff);
    auVar91 = vsubps_avx512vl(auVar84,auVar94);
    uVar147 = auVar91._0_4_;
    auVar212._4_4_ = uVar147;
    auVar212._0_4_ = uVar147;
    auVar212._8_4_ = uVar147;
    auVar212._12_4_ = uVar147;
    auVar93 = vshufps_avx(auVar91,auVar91,0x55);
    auVar91 = vshufps_avx(auVar91,auVar91,0xaa);
    auVar220._0_4_ = fVar168 * auVar91._0_4_;
    auVar220._4_4_ = fVar162 * auVar91._4_4_;
    auVar220._8_4_ = fVar163 * auVar91._8_4_;
    auVar220._12_4_ = fVar164 * auVar91._12_4_;
    auVar93 = vfmadd231ps_fma(auVar220,(undefined1  [16])aVar7,auVar93);
    auVar91 = vfmadd231ps_fma(auVar93,(undefined1  [16])aVar6,auVar212);
    auVar92 = vshufps_avx512vl(auVar84,auVar84,0xff);
    auVar67._12_4_ = fStack_6c4;
    auVar67._0_12_ = *pauVar5;
    auVar93 = vsubps_avx512vl(auVar67,auVar94);
    uVar147 = auVar93._0_4_;
    auVar182._4_4_ = uVar147;
    auVar182._0_4_ = uVar147;
    auVar182._8_4_ = uVar147;
    auVar182._12_4_ = uVar147;
    auVar94 = vshufps_avx(auVar93,auVar93,0x55);
    auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
    auVar224._0_4_ = fVar168 * auVar93._0_4_;
    auVar224._4_4_ = fVar162 * auVar93._4_4_;
    auVar224._8_4_ = fVar163 * auVar93._8_4_;
    auVar224._12_4_ = fVar164 * auVar93._12_4_;
    auVar94 = vfmadd231ps_fma(auVar224,(undefined1  [16])aVar7,auVar94);
    auVar93 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar6,auVar182);
    auVar94 = vshufps_avx512vl(auVar67,auVar67,0xff);
    lVar74 = (long)iVar10;
    lVar79 = lVar74 * 0x44;
    auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar79);
    uVar147 = auVar148._0_4_;
    local_420._4_4_ = uVar147;
    local_420._0_4_ = uVar147;
    local_420._8_4_ = uVar147;
    local_420._12_4_ = uVar147;
    local_420._16_4_ = uVar147;
    local_420._20_4_ = uVar147;
    local_420._24_4_ = uVar147;
    local_420._28_4_ = uVar147;
    auVar96._8_4_ = 1;
    auVar96._0_8_ = 0x100000001;
    auVar96._12_4_ = 1;
    auVar96._16_4_ = 1;
    auVar96._20_4_ = 1;
    auVar96._24_4_ = 1;
    auVar96._28_4_ = 1;
    local_440 = vpermps_avx2(auVar96,ZEXT1632(auVar148));
    local_80 = vbroadcastsd_avx512vl(auVar89);
    auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x484);
    uVar147 = auVar149._0_4_;
    auVar166._4_4_ = uVar147;
    auVar166._0_4_ = uVar147;
    auVar166._8_4_ = uVar147;
    auVar166._12_4_ = uVar147;
    local_460._16_4_ = uVar147;
    local_460._0_16_ = auVar166;
    local_460._20_4_ = uVar147;
    local_460._24_4_ = uVar147;
    local_460._28_4_ = uVar147;
    local_480 = vpermps_avx512vl(auVar96,ZEXT1632(auVar149));
    local_a0 = vbroadcastsd_avx512vl(auVar90);
    auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x908);
    uVar147 = auVar91._0_4_;
    local_4a0._4_4_ = uVar147;
    local_4a0._0_4_ = uVar147;
    local_4a0._8_4_ = uVar147;
    local_4a0._12_4_ = uVar147;
    local_4a0._16_4_ = uVar147;
    local_4a0._20_4_ = uVar147;
    local_4a0._24_4_ = uVar147;
    local_4a0._28_4_ = uVar147;
    local_4c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar91));
    local_c0 = vbroadcastsd_avx512vl(auVar92);
    auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0xd8c);
    fVar162 = auVar93._0_4_;
    local_4e0._4_4_ = fVar162;
    local_4e0._0_4_ = fVar162;
    fStack_4d8 = fVar162;
    fStack_4d4 = fVar162;
    fStack_4d0 = fVar162;
    fStack_4cc = fVar162;
    fStack_4c8 = fVar162;
    register0x0000139c = fVar162;
    _local_500 = vpermps_avx512vl(auVar96,ZEXT1632(auVar93));
    local_e0 = vbroadcastsd_avx512vl(auVar94);
    auVar96 = vmulps_avx512vl(_local_4e0,auVar109);
    auVar97 = vmulps_avx512vl(_local_500,auVar109);
    auVar94 = vfmadd231ps_fma(auVar96,auVar110,local_4a0);
    auVar96 = vfmadd231ps_avx512vl(auVar97,auVar110,local_4c0);
    auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar113,local_460);
    auVar98 = vfmadd231ps_avx512vl(auVar96,auVar113,local_480);
    auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar112,local_420);
    auVar208 = ZEXT3264(auVar99);
    auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar79);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x484);
    auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x908);
    auVar100 = vfmadd231ps_avx512vl(auVar98,auVar112,local_440);
    auVar198 = ZEXT3264(auVar100);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0xd8c);
    auVar101 = vmulps_avx512vl(_local_4e0,auVar98);
    auVar102 = vmulps_avx512vl(_local_500,auVar98);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_4a0);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,local_4c0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_460);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_480);
    auVar89 = vfmadd231ps_fma(auVar101,auVar96,local_420);
    auVar213 = ZEXT1664(auVar89);
    auVar90 = vfmadd231ps_fma(auVar102,auVar96,local_440);
    auVar101 = vsubps_avx512vl(ZEXT1632(auVar89),auVar99);
    auVar102 = vsubps_avx512vl(ZEXT1632(auVar90),auVar100);
    auVar103 = vmulps_avx512vl(auVar100,auVar101);
    auVar104 = vmulps_avx512vl(auVar99,auVar102);
    auVar103 = vsubps_avx512vl(auVar103,auVar104);
    auVar104 = vmulps_avx512vl(local_e0,auVar109);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar110,local_c0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_a0);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar112,local_80);
    auVar105 = vmulps_avx512vl(local_e0,auVar98);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar108,local_c0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar97,local_a0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_80);
    auVar106 = vmulps_avx512vl(auVar102,auVar102);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,auVar101);
    auVar107 = vmaxps_avx512vl(auVar104,auVar105);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vmulps_avx512vl(auVar107,auVar106);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    uVar25 = vcmpps_avx512vl(auVar103,auVar106,2);
    auVar94 = vblendps_avx(auVar148,auVar87,8);
    auVar92 = auVar228._0_16_;
    auVar94 = vandps_avx512vl(auVar94,auVar92);
    auVar88 = vblendps_avx(auVar149,auVar88,8);
    auVar88 = vandps_avx512vl(auVar88,auVar92);
    auVar94 = vmaxps_avx(auVar94,auVar88);
    auVar88 = vblendps_avx(auVar91,auVar84,8);
    auVar84 = vandps_avx512vl(auVar88,auVar92);
    auVar88 = vblendps_avx(auVar93,auVar67,8);
    auVar88 = vandps_avx512vl(auVar88,auVar92);
    auVar88 = vmaxps_avx(auVar84,auVar88);
    auVar88 = vmaxps_avx(auVar94,auVar88);
    auVar84 = vmovshdup_avx(auVar88);
    auVar84 = vmaxss_avx(auVar84,auVar88);
    auVar88 = vshufpd_avx(auVar88,auVar88,1);
    auVar88 = vmaxss_avx(auVar88,auVar84);
    auVar84 = vcvtsi2ss_avx512f(auVar92,iVar10);
    local_5a0._0_16_ = auVar84;
    auVar107._0_4_ = auVar84._0_4_;
    auVar107._4_4_ = auVar107._0_4_;
    auVar107._8_4_ = auVar107._0_4_;
    auVar107._12_4_ = auVar107._0_4_;
    auVar107._16_4_ = auVar107._0_4_;
    auVar107._20_4_ = auVar107._0_4_;
    auVar107._24_4_ = auVar107._0_4_;
    auVar107._28_4_ = auVar107._0_4_;
    uVar26 = vcmpps_avx512vl(auVar107,_DAT_01f7b060,0xe);
    bVar81 = (byte)uVar25 & (byte)uVar26;
    fVar168 = auVar88._0_4_ * 4.7683716e-07;
    local_640 = ZEXT416((uint)fVar168);
    auVar106._8_4_ = 2;
    auVar106._0_8_ = 0x200000002;
    auVar106._12_4_ = 2;
    auVar106._16_4_ = 2;
    auVar106._20_4_ = 2;
    auVar106._24_4_ = 2;
    auVar106._28_4_ = 2;
    local_560 = vpermps_avx512vl(auVar106,ZEXT1632(auVar148));
    auVar229 = ZEXT3264(local_560);
    local_580 = vpermps_avx512vl(auVar106,ZEXT1632(auVar149));
    auVar230 = ZEXT3264(local_580);
    auVar103 = vpermps_avx512vl(auVar106,ZEXT1632(auVar91));
    auVar227 = ZEXT3264(auVar103);
    local_260 = vpermps_avx2(auVar106,ZEXT1632(auVar93));
    local_520 = *(undefined4 *)(ray + sVar80 * 4 + 0x60);
    uStack_51c = 0;
    uStack_518 = 0;
    uStack_514 = 0;
    local_280 = vpbroadcastd_avx512vl();
    local_2a0 = vpbroadcastd_avx512vl();
    if (bVar81 != 0) {
      auVar98 = vmulps_avx512vl(local_260,auVar98);
      auVar108 = vfmadd213ps_avx512vl(auVar108,auVar103,auVar98);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_580,auVar108);
      auVar106 = vfmadd213ps_avx512vl(auVar96,local_560,auVar97);
      auVar109 = vmulps_avx512vl(local_260,auVar109);
      auVar110 = vfmadd213ps_avx512vl(auVar110,auVar103,auVar109);
      auVar97 = vfmadd213ps_avx512vl(auVar113,local_580,auVar110);
      auVar113 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1210);
      auVar110 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1694);
      auVar109 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1b18);
      auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 + 0x1f9c);
      auVar111 = vfmadd213ps_avx512vl(auVar112,local_560,auVar97);
      auVar218._0_4_ = fVar162 * auVar96._0_4_;
      auVar218._4_4_ = fVar162 * auVar96._4_4_;
      auVar218._8_4_ = fVar162 * auVar96._8_4_;
      auVar218._12_4_ = fVar162 * auVar96._12_4_;
      auVar218._16_4_ = fVar162 * auVar96._16_4_;
      auVar218._20_4_ = fVar162 * auVar96._20_4_;
      auVar218._24_4_ = fVar162 * auVar96._24_4_;
      auVar218._28_4_ = 0;
      auVar112 = vmulps_avx512vl(_local_500,auVar96);
      auVar96 = vmulps_avx512vl(local_260,auVar96);
      auVar97 = vfmadd231ps_avx512vl(auVar218,auVar109,local_4a0);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar109,local_4c0);
      auVar109 = vfmadd231ps_avx512vl(auVar96,auVar103,auVar109);
      auVar96 = vfmadd231ps_avx512vl(auVar97,auVar110,local_460);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar110,local_480);
      auVar97 = vfmadd231ps_avx512vl(auVar109,local_580,auVar110);
      auVar88 = vfmadd231ps_fma(auVar96,auVar113,local_420);
      auVar96 = vfmadd231ps_avx512vl(auVar112,auVar113,local_440);
      auVar112 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1210);
      auVar110 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1b18);
      auVar109 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1f9c);
      auVar108 = vfmadd231ps_avx512vl(auVar97,local_560,auVar113);
      auVar97._4_4_ = fVar162 * auVar109._4_4_;
      auVar97._0_4_ = fVar162 * auVar109._0_4_;
      auVar97._8_4_ = fVar162 * auVar109._8_4_;
      auVar97._12_4_ = fVar162 * auVar109._12_4_;
      auVar97._16_4_ = fVar162 * auVar109._16_4_;
      auVar97._20_4_ = fVar162 * auVar109._20_4_;
      auVar97._24_4_ = fVar162 * auVar109._24_4_;
      auVar97._28_4_ = auVar113._28_4_;
      auVar113 = vmulps_avx512vl(_local_500,auVar109);
      auVar109 = vmulps_avx512vl(local_260,auVar109);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar110,local_4a0);
      auVar98 = vfmadd231ps_avx512vl(auVar113,auVar110,local_4c0);
      auVar110 = vfmadd231ps_avx512vl(auVar109,auVar103,auVar110);
      auVar113 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 + 0x1694);
      auVar109 = vfmadd231ps_avx512vl(auVar97,auVar113,local_460);
      auVar97 = vfmadd231ps_avx512vl(auVar98,auVar113,local_480);
      auVar113 = vfmadd231ps_avx512vl(auVar110,local_580,auVar113);
      auVar84 = vfmadd231ps_fma(auVar109,auVar112,local_420);
      auVar110 = vfmadd231ps_avx512vl(auVar97,auVar112,local_440);
      auVar109 = vfmadd231ps_avx512vl(auVar113,local_560,auVar112);
      auVar225._8_4_ = 0x7fffffff;
      auVar225._0_8_ = 0x7fffffff7fffffff;
      auVar225._12_4_ = 0x7fffffff;
      auVar225._16_4_ = 0x7fffffff;
      auVar225._20_4_ = 0x7fffffff;
      auVar225._24_4_ = 0x7fffffff;
      auVar225._28_4_ = 0x7fffffff;
      auVar112 = vandps_avx(ZEXT1632(auVar88),auVar225);
      auVar113 = vandps_avx(auVar96,auVar225);
      auVar113 = vmaxps_avx(auVar112,auVar113);
      auVar112 = vandps_avx(auVar108,auVar225);
      auVar112 = vmaxps_avx(auVar113,auVar112);
      auVar221._4_4_ = fVar168;
      auVar221._0_4_ = fVar168;
      auVar221._8_4_ = fVar168;
      auVar221._12_4_ = fVar168;
      auVar221._16_4_ = fVar168;
      auVar221._20_4_ = fVar168;
      auVar221._24_4_ = fVar168;
      auVar221._28_4_ = fVar168;
      uVar71 = vcmpps_avx512vl(auVar112,auVar221,1);
      bVar13 = (bool)((byte)uVar71 & 1);
      auVar114._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar88._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar88._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar88._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar88._12_4_);
      fVar163 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar101._16_4_);
      auVar114._16_4_ = fVar163;
      fVar162 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar101._20_4_);
      auVar114._20_4_ = fVar162;
      fVar164 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar101._24_4_);
      auVar114._24_4_ = fVar164;
      uVar72 = (uint)(byte)(uVar71 >> 7) * auVar101._28_4_;
      auVar114._28_4_ = uVar72;
      bVar13 = (bool)((byte)uVar71 & 1);
      auVar115._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar96._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar115._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar96._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar115._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar96._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar115._12_4_ = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar96._12_4_);
      bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar115._16_4_ = (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar96._16_4_);
      bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar115._20_4_ = (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar96._20_4_);
      bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar115._24_4_ = (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar96._24_4_);
      bVar13 = SUB81(uVar71 >> 7,0);
      auVar115._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar96._28_4_;
      auVar112 = vandps_avx(auVar225,ZEXT1632(auVar84));
      auVar113 = vandps_avx(auVar110,auVar225);
      auVar113 = vmaxps_avx(auVar112,auVar113);
      auVar112 = vandps_avx(auVar109,auVar225);
      auVar112 = vmaxps_avx(auVar113,auVar112);
      uVar71 = vcmpps_avx512vl(auVar112,auVar221,1);
      bVar13 = (bool)((byte)uVar71 & 1);
      auVar116._0_4_ = (float)((uint)bVar13 * auVar101._0_4_ | (uint)!bVar13 * auVar84._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar116._4_4_ = (float)((uint)bVar13 * auVar101._4_4_ | (uint)!bVar13 * auVar84._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar116._8_4_ = (float)((uint)bVar13 * auVar101._8_4_ | (uint)!bVar13 * auVar84._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar116._12_4_ = (float)((uint)bVar13 * auVar101._12_4_ | (uint)!bVar13 * auVar84._12_4_);
      fVar177 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar101._16_4_);
      auVar116._16_4_ = fVar177;
      fVar176 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar101._20_4_);
      auVar116._20_4_ = fVar176;
      fVar190 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar101._24_4_);
      auVar116._24_4_ = fVar190;
      auVar116._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar101._28_4_;
      bVar13 = (bool)((byte)uVar71 & 1);
      auVar117._0_4_ = (float)((uint)bVar13 * auVar102._0_4_ | (uint)!bVar13 * auVar110._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar117._4_4_ = (float)((uint)bVar13 * auVar102._4_4_ | (uint)!bVar13 * auVar110._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar117._8_4_ = (float)((uint)bVar13 * auVar102._8_4_ | (uint)!bVar13 * auVar110._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar117._12_4_ = (float)((uint)bVar13 * auVar102._12_4_ | (uint)!bVar13 * auVar110._12_4_);
      bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar117._16_4_ = (float)((uint)bVar13 * auVar102._16_4_ | (uint)!bVar13 * auVar110._16_4_);
      bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar117._20_4_ = (float)((uint)bVar13 * auVar102._20_4_ | (uint)!bVar13 * auVar110._20_4_);
      bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar117._24_4_ = (float)((uint)bVar13 * auVar102._24_4_ | (uint)!bVar13 * auVar110._24_4_);
      bVar13 = SUB81(uVar71 >> 7,0);
      auVar117._28_4_ = (uint)bVar13 * auVar102._28_4_ | (uint)!bVar13 * auVar110._28_4_;
      auVar95 = vxorps_avx512vl(auVar166,auVar166);
      auVar112 = vfmadd213ps_avx512vl(auVar114,auVar114,ZEXT1632(auVar95));
      auVar88 = vfmadd231ps_fma(auVar112,auVar115,auVar115);
      auVar110 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar82 = auVar110._0_4_;
      fVar83 = auVar110._4_4_;
      fVar139 = auVar110._8_4_;
      fVar140 = auVar110._12_4_;
      fVar141 = auVar110._16_4_;
      fVar142 = auVar110._20_4_;
      fVar143 = auVar110._24_4_;
      auVar112._4_4_ = fVar83 * fVar83 * fVar83 * auVar88._4_4_ * -0.5;
      auVar112._0_4_ = fVar82 * fVar82 * fVar82 * auVar88._0_4_ * -0.5;
      auVar112._8_4_ = fVar139 * fVar139 * fVar139 * auVar88._8_4_ * -0.5;
      auVar112._12_4_ = fVar140 * fVar140 * fVar140 * auVar88._12_4_ * -0.5;
      auVar112._16_4_ = fVar141 * fVar141 * fVar141 * -0.0;
      auVar112._20_4_ = fVar142 * fVar142 * fVar142 * -0.0;
      auVar112._24_4_ = fVar143 * fVar143 * fVar143 * -0.0;
      auVar112._28_4_ = 0;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar96,auVar110);
      auVar113._4_4_ = auVar115._4_4_ * auVar112._4_4_;
      auVar113._0_4_ = auVar115._0_4_ * auVar112._0_4_;
      auVar113._8_4_ = auVar115._8_4_ * auVar112._8_4_;
      auVar113._12_4_ = auVar115._12_4_ * auVar112._12_4_;
      auVar113._16_4_ = auVar115._16_4_ * auVar112._16_4_;
      auVar113._20_4_ = auVar115._20_4_ * auVar112._20_4_;
      auVar113._24_4_ = auVar115._24_4_ * auVar112._24_4_;
      auVar113._28_4_ = auVar110._28_4_;
      auVar110._4_4_ = auVar112._4_4_ * -auVar114._4_4_;
      auVar110._0_4_ = auVar112._0_4_ * -auVar114._0_4_;
      auVar110._8_4_ = auVar112._8_4_ * -auVar114._8_4_;
      auVar110._12_4_ = auVar112._12_4_ * -auVar114._12_4_;
      auVar110._16_4_ = auVar112._16_4_ * -fVar163;
      auVar110._20_4_ = auVar112._20_4_ * -fVar162;
      auVar110._24_4_ = auVar112._24_4_ * -fVar164;
      auVar110._28_4_ = uVar72 ^ 0x80000000;
      auVar97 = vmulps_avx512vl(auVar112,ZEXT1632(auVar95));
      auVar101 = ZEXT1632(auVar95);
      auVar109 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar101);
      auVar88 = vfmadd231ps_fma(auVar109,auVar117,auVar117);
      auVar98 = vrsqrt14ps_avx512vl(ZEXT1632(auVar88));
      fVar162 = auVar98._0_4_;
      fVar163 = auVar98._4_4_;
      fVar164 = auVar98._8_4_;
      fVar82 = auVar98._12_4_;
      fVar83 = auVar98._16_4_;
      fVar139 = auVar98._20_4_;
      fVar140 = auVar98._24_4_;
      auVar109._4_4_ = fVar163 * fVar163 * fVar163 * auVar88._4_4_ * -0.5;
      auVar109._0_4_ = fVar162 * fVar162 * fVar162 * auVar88._0_4_ * -0.5;
      auVar109._8_4_ = fVar164 * fVar164 * fVar164 * auVar88._8_4_ * -0.5;
      auVar109._12_4_ = fVar82 * fVar82 * fVar82 * auVar88._12_4_ * -0.5;
      auVar109._16_4_ = fVar83 * fVar83 * fVar83 * -0.0;
      auVar109._20_4_ = fVar139 * fVar139 * fVar139 * -0.0;
      auVar109._24_4_ = fVar140 * fVar140 * fVar140 * -0.0;
      auVar109._28_4_ = 0;
      auVar109 = vfmadd231ps_avx512vl(auVar109,auVar96,auVar98);
      auVar108._4_4_ = auVar117._4_4_ * auVar109._4_4_;
      auVar108._0_4_ = auVar117._0_4_ * auVar109._0_4_;
      auVar108._8_4_ = auVar117._8_4_ * auVar109._8_4_;
      auVar108._12_4_ = auVar117._12_4_ * auVar109._12_4_;
      auVar108._16_4_ = auVar117._16_4_ * auVar109._16_4_;
      auVar108._20_4_ = auVar117._20_4_ * auVar109._20_4_;
      auVar108._24_4_ = auVar117._24_4_ * auVar109._24_4_;
      auVar108._28_4_ = auVar98._28_4_;
      auVar98._4_4_ = -auVar116._4_4_ * auVar109._4_4_;
      auVar98._0_4_ = -auVar116._0_4_ * auVar109._0_4_;
      auVar98._8_4_ = -auVar116._8_4_ * auVar109._8_4_;
      auVar98._12_4_ = -auVar116._12_4_ * auVar109._12_4_;
      auVar98._16_4_ = -fVar177 * auVar109._16_4_;
      auVar98._20_4_ = -fVar176 * auVar109._20_4_;
      auVar98._24_4_ = -fVar190 * auVar109._24_4_;
      auVar98._28_4_ = auVar112._28_4_;
      auVar112 = vmulps_avx512vl(auVar109,auVar101);
      auVar88 = vfmadd213ps_fma(auVar113,auVar104,auVar99);
      auVar84 = vfmadd213ps_fma(auVar110,auVar104,auVar100);
      auVar109 = vfmadd213ps_avx512vl(auVar97,auVar104,auVar111);
      auVar96 = vfmadd213ps_avx512vl(auVar108,auVar105,ZEXT1632(auVar89));
      auVar91 = vfnmadd213ps_fma(auVar113,auVar104,auVar99);
      auVar94 = vfmadd213ps_fma(auVar98,auVar105,ZEXT1632(auVar90));
      auVar148 = vfnmadd213ps_fma(auVar110,auVar104,auVar100);
      auVar93 = vfmadd213ps_fma(auVar112,auVar105,auVar106);
      auVar113 = vfnmadd231ps_avx512vl(auVar111,auVar104,auVar97);
      auVar149 = vfnmadd213ps_fma(auVar108,auVar105,ZEXT1632(auVar89));
      auVar92 = vfnmadd213ps_fma(auVar98,auVar105,ZEXT1632(auVar90));
      auVar165 = vfnmadd231ps_fma(auVar106,auVar105,auVar112);
      auVar110 = vsubps_avx512vl(auVar96,ZEXT1632(auVar91));
      auVar112 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar148));
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar93),auVar113);
      auVar108 = vmulps_avx512vl(auVar112,auVar113);
      auVar89 = vfmsub231ps_fma(auVar108,ZEXT1632(auVar148),auVar97);
      auVar99._4_4_ = auVar91._4_4_ * auVar97._4_4_;
      auVar99._0_4_ = auVar91._0_4_ * auVar97._0_4_;
      auVar99._8_4_ = auVar91._8_4_ * auVar97._8_4_;
      auVar99._12_4_ = auVar91._12_4_ * auVar97._12_4_;
      auVar99._16_4_ = auVar97._16_4_ * 0.0;
      auVar99._20_4_ = auVar97._20_4_ * 0.0;
      auVar99._24_4_ = auVar97._24_4_ * 0.0;
      auVar99._28_4_ = auVar97._28_4_;
      auVar97 = vfmsub231ps_avx512vl(auVar99,auVar113,auVar110);
      auVar100._4_4_ = auVar148._4_4_ * auVar110._4_4_;
      auVar100._0_4_ = auVar148._0_4_ * auVar110._0_4_;
      auVar100._8_4_ = auVar148._8_4_ * auVar110._8_4_;
      auVar100._12_4_ = auVar148._12_4_ * auVar110._12_4_;
      auVar100._16_4_ = auVar110._16_4_ * 0.0;
      auVar100._20_4_ = auVar110._20_4_ * 0.0;
      auVar100._24_4_ = auVar110._24_4_ * 0.0;
      auVar100._28_4_ = auVar110._28_4_;
      auVar90 = vfmsub231ps_fma(auVar100,ZEXT1632(auVar91),auVar112);
      auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar101,auVar97);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,ZEXT1632(auVar89));
      auVar106 = ZEXT1632(auVar95);
      uVar71 = vcmpps_avx512vl(auVar112,auVar106,2);
      bVar70 = (byte)uVar71;
      fVar82 = (float)((uint)(bVar70 & 1) * auVar88._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar149._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      fVar139 = (float)((uint)bVar13 * auVar88._4_4_ | (uint)!bVar13 * auVar149._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      fVar141 = (float)((uint)bVar13 * auVar88._8_4_ | (uint)!bVar13 * auVar149._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      fVar143 = (float)((uint)bVar13 * auVar88._12_4_ | (uint)!bVar13 * auVar149._12_4_);
      auVar108 = ZEXT1632(CONCAT412(fVar143,CONCAT48(fVar141,CONCAT44(fVar139,fVar82))));
      fVar83 = (float)((uint)(bVar70 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar92._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      fVar140 = (float)((uint)bVar13 * auVar84._4_4_ | (uint)!bVar13 * auVar92._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      fVar142 = (float)((uint)bVar13 * auVar84._8_4_ | (uint)!bVar13 * auVar92._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      fVar144 = (float)((uint)bVar13 * auVar84._12_4_ | (uint)!bVar13 * auVar92._12_4_);
      auVar98 = ZEXT1632(CONCAT412(fVar144,CONCAT48(fVar142,CONCAT44(fVar140,fVar83))));
      auVar118._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar165._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar118._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar165._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar118._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar165._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar118._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar165._12_4_);
      fVar162 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar109._16_4_);
      auVar118._16_4_ = fVar162;
      fVar163 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar109._20_4_);
      auVar118._20_4_ = fVar163;
      fVar164 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar109._24_4_);
      auVar118._24_4_ = fVar164;
      iVar1 = (uint)(byte)(uVar71 >> 7) * auVar109._28_4_;
      auVar118._28_4_ = iVar1;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar91),auVar96);
      auVar119._0_4_ =
           (uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar84._0_4_;
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar84._4_4_;
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar84._8_4_;
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar84._12_4_;
      auVar119._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar110._16_4_;
      auVar119._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar110._20_4_;
      auVar119._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar110._24_4_;
      auVar119._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(ZEXT1632(auVar148),ZEXT1632(auVar94));
      auVar120._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar120._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar89._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar120._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar89._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar120._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar89._12_4_);
      fVar190 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar110._16_4_);
      auVar120._16_4_ = fVar190;
      fVar176 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar110._20_4_);
      auVar120._20_4_ = fVar176;
      fVar177 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar110._24_4_);
      auVar120._24_4_ = fVar177;
      auVar120._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar110._28_4_;
      auVar110 = vblendmps_avx512vl(auVar113,ZEXT1632(auVar93));
      auVar121._0_4_ =
           (float)((uint)(bVar70 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar109._0_4_)
      ;
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar121._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar109._4_4_);
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar121._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar109._8_4_);
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar121._12_4_ = (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar109._12_4_);
      bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar121._16_4_ = (float)((uint)bVar13 * auVar110._16_4_ | (uint)!bVar13 * auVar109._16_4_);
      bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar121._20_4_ = (float)((uint)bVar13 * auVar110._20_4_ | (uint)!bVar13 * auVar109._20_4_);
      bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar121._24_4_ = (float)((uint)bVar13 * auVar110._24_4_ | (uint)!bVar13 * auVar109._24_4_);
      bVar13 = SUB81(uVar71 >> 7,0);
      auVar121._28_4_ = (uint)bVar13 * auVar110._28_4_ | (uint)!bVar13 * auVar109._28_4_;
      auVar122._0_4_ =
           (uint)(bVar70 & 1) * (int)auVar91._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar96._0_4_;
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar13 * (int)auVar91._4_4_ | (uint)!bVar13 * auVar96._4_4_;
      bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar13 * (int)auVar91._8_4_ | (uint)!bVar13 * auVar96._8_4_;
      bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar13 * (int)auVar91._12_4_ | (uint)!bVar13 * auVar96._12_4_;
      auVar122._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar96._16_4_;
      auVar122._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar96._20_4_;
      auVar122._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar96._24_4_;
      auVar122._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar96._28_4_;
      bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
      bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
      bVar16 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar123._0_4_ =
           (uint)(bVar70 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar93._0_4_;
      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar123._4_4_ = (uint)bVar14 * auVar113._4_4_ | (uint)!bVar14 * auVar93._4_4_;
      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar123._8_4_ = (uint)bVar14 * auVar113._8_4_ | (uint)!bVar14 * auVar93._8_4_;
      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar123._12_4_ = (uint)bVar14 * auVar113._12_4_ | (uint)!bVar14 * auVar93._12_4_;
      auVar123._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar113._16_4_;
      auVar123._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar113._20_4_;
      auVar123._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar113._24_4_;
      iVar2 = (uint)(byte)(uVar71 >> 7) * auVar113._28_4_;
      auVar123._28_4_ = iVar2;
      auVar99 = vsubps_avx512vl(auVar122,auVar108);
      auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar148._12_4_ |
                                               (uint)!bVar16 * auVar94._12_4_,
                                               CONCAT48((uint)bVar15 * (int)auVar148._8_4_ |
                                                        (uint)!bVar15 * auVar94._8_4_,
                                                        CONCAT44((uint)bVar13 * (int)auVar148._4_4_
                                                                 | (uint)!bVar13 * auVar94._4_4_,
                                                                 (uint)(bVar70 & 1) *
                                                                 (int)auVar148._0_4_ |
                                                                 (uint)!(bool)(bVar70 & 1) *
                                                                 auVar94._0_4_)))),auVar98);
      auVar208 = ZEXT3264(auVar113);
      auVar110 = vsubps_avx(auVar123,auVar118);
      auVar109 = vsubps_avx(auVar108,auVar119);
      auVar213 = ZEXT3264(auVar109);
      auVar96 = vsubps_avx(auVar98,auVar120);
      auVar97 = vsubps_avx(auVar118,auVar121);
      auVar101._4_4_ = auVar110._4_4_ * fVar139;
      auVar101._0_4_ = auVar110._0_4_ * fVar82;
      auVar101._8_4_ = auVar110._8_4_ * fVar141;
      auVar101._12_4_ = auVar110._12_4_ * fVar143;
      auVar101._16_4_ = auVar110._16_4_ * 0.0;
      auVar101._20_4_ = auVar110._20_4_ * 0.0;
      auVar101._24_4_ = auVar110._24_4_ * 0.0;
      auVar101._28_4_ = iVar2;
      auVar88 = vfmsub231ps_fma(auVar101,auVar118,auVar99);
      auVar102._4_4_ = fVar140 * auVar99._4_4_;
      auVar102._0_4_ = fVar83 * auVar99._0_4_;
      auVar102._8_4_ = fVar142 * auVar99._8_4_;
      auVar102._12_4_ = fVar144 * auVar99._12_4_;
      auVar102._16_4_ = auVar99._16_4_ * 0.0;
      auVar102._20_4_ = auVar99._20_4_ * 0.0;
      auVar102._24_4_ = auVar99._24_4_ * 0.0;
      auVar102._28_4_ = auVar112._28_4_;
      auVar84 = vfmsub231ps_fma(auVar102,auVar108,auVar113);
      auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar106,ZEXT1632(auVar88));
      auVar193._0_4_ = auVar113._0_4_ * auVar118._0_4_;
      auVar193._4_4_ = auVar113._4_4_ * auVar118._4_4_;
      auVar193._8_4_ = auVar113._8_4_ * auVar118._8_4_;
      auVar193._12_4_ = auVar113._12_4_ * auVar118._12_4_;
      auVar193._16_4_ = auVar113._16_4_ * fVar162;
      auVar193._20_4_ = auVar113._20_4_ * fVar163;
      auVar193._24_4_ = auVar113._24_4_ * fVar164;
      auVar193._28_4_ = 0;
      auVar88 = vfmsub231ps_fma(auVar193,auVar98,auVar110);
      auVar100 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar88));
      auVar112 = vmulps_avx512vl(auVar97,auVar119);
      auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar121);
      auVar111._4_4_ = auVar96._4_4_ * auVar121._4_4_;
      auVar111._0_4_ = auVar96._0_4_ * auVar121._0_4_;
      auVar111._8_4_ = auVar96._8_4_ * auVar121._8_4_;
      auVar111._12_4_ = auVar96._12_4_ * auVar121._12_4_;
      auVar111._16_4_ = auVar96._16_4_ * auVar121._16_4_;
      auVar111._20_4_ = auVar96._20_4_ * auVar121._20_4_;
      auVar111._24_4_ = auVar96._24_4_ * auVar121._24_4_;
      auVar111._28_4_ = auVar121._28_4_;
      auVar88 = vfmsub231ps_fma(auVar111,auVar120,auVar97);
      auVar194._0_4_ = auVar120._0_4_ * auVar109._0_4_;
      auVar194._4_4_ = auVar120._4_4_ * auVar109._4_4_;
      auVar194._8_4_ = auVar120._8_4_ * auVar109._8_4_;
      auVar194._12_4_ = auVar120._12_4_ * auVar109._12_4_;
      auVar194._16_4_ = fVar190 * auVar109._16_4_;
      auVar194._20_4_ = fVar176 * auVar109._20_4_;
      auVar194._24_4_ = fVar177 * auVar109._24_4_;
      auVar194._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar194,auVar96,auVar119);
      auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar106,auVar112);
      auVar101 = vfmadd231ps_avx512vl(auVar112,auVar106,ZEXT1632(auVar88));
      auVar198 = ZEXT3264(auVar101);
      auVar112 = vmaxps_avx(auVar100,auVar101);
      uVar25 = vcmpps_avx512vl(auVar112,auVar106,2);
      bVar81 = bVar81 & (byte)uVar25;
      if (bVar81 != 0) {
        auVar36._4_4_ = auVar97._4_4_ * auVar113._4_4_;
        auVar36._0_4_ = auVar97._0_4_ * auVar113._0_4_;
        auVar36._8_4_ = auVar97._8_4_ * auVar113._8_4_;
        auVar36._12_4_ = auVar97._12_4_ * auVar113._12_4_;
        auVar36._16_4_ = auVar97._16_4_ * auVar113._16_4_;
        auVar36._20_4_ = auVar97._20_4_ * auVar113._20_4_;
        auVar36._24_4_ = auVar97._24_4_ * auVar113._24_4_;
        auVar36._28_4_ = auVar112._28_4_;
        auVar89 = vfmsub231ps_fma(auVar36,auVar96,auVar110);
        auVar37._4_4_ = auVar110._4_4_ * auVar109._4_4_;
        auVar37._0_4_ = auVar110._0_4_ * auVar109._0_4_;
        auVar37._8_4_ = auVar110._8_4_ * auVar109._8_4_;
        auVar37._12_4_ = auVar110._12_4_ * auVar109._12_4_;
        auVar37._16_4_ = auVar110._16_4_ * auVar109._16_4_;
        auVar37._20_4_ = auVar110._20_4_ * auVar109._20_4_;
        auVar37._24_4_ = auVar110._24_4_ * auVar109._24_4_;
        auVar37._28_4_ = auVar110._28_4_;
        auVar94 = vfmsub231ps_fma(auVar37,auVar99,auVar97);
        auVar38._4_4_ = auVar96._4_4_ * auVar99._4_4_;
        auVar38._0_4_ = auVar96._0_4_ * auVar99._0_4_;
        auVar38._8_4_ = auVar96._8_4_ * auVar99._8_4_;
        auVar38._12_4_ = auVar96._12_4_ * auVar99._12_4_;
        auVar38._16_4_ = auVar96._16_4_ * auVar99._16_4_;
        auVar38._20_4_ = auVar96._20_4_ * auVar99._20_4_;
        auVar38._24_4_ = auVar96._24_4_ * auVar99._24_4_;
        auVar38._28_4_ = auVar96._28_4_;
        auVar90 = vfmsub231ps_fma(auVar38,auVar109,auVar113);
        auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar94),ZEXT1632(auVar90));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar89),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar112 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
        auVar213 = ZEXT3264(auVar112);
        auVar30._8_4_ = 0x3f800000;
        auVar30._0_8_ = 0x3f8000003f800000;
        auVar30._12_4_ = 0x3f800000;
        auVar30._16_4_ = 0x3f800000;
        auVar30._20_4_ = 0x3f800000;
        auVar30._24_4_ = 0x3f800000;
        auVar30._28_4_ = 0x3f800000;
        auVar113 = vfnmadd213ps_avx512vl(auVar112,ZEXT1632(auVar84),auVar30);
        auVar88 = vfmadd132ps_fma(auVar113,auVar112,auVar112);
        auVar208 = ZEXT1664(auVar88);
        auVar39._4_4_ = auVar90._4_4_ * auVar118._4_4_;
        auVar39._0_4_ = auVar90._0_4_ * auVar118._0_4_;
        auVar39._8_4_ = auVar90._8_4_ * auVar118._8_4_;
        auVar39._12_4_ = auVar90._12_4_ * auVar118._12_4_;
        auVar39._16_4_ = fVar162 * 0.0;
        auVar39._20_4_ = fVar163 * 0.0;
        auVar39._24_4_ = fVar164 * 0.0;
        auVar39._28_4_ = iVar1;
        auVar94 = vfmadd231ps_fma(auVar39,auVar98,ZEXT1632(auVar94));
        auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar108,ZEXT1632(auVar89));
        fVar162 = auVar88._0_4_;
        fVar163 = auVar88._4_4_;
        fVar164 = auVar88._8_4_;
        fVar177 = auVar88._12_4_;
        local_3c0 = ZEXT1632(CONCAT412(auVar94._12_4_ * fVar177,
                                       CONCAT48(auVar94._8_4_ * fVar164,
                                                CONCAT44(auVar94._4_4_ * fVar163,
                                                         auVar94._0_4_ * fVar162))));
        auVar216 = ZEXT3264(local_3c0);
        auVar154._4_4_ = local_520;
        auVar154._0_4_ = local_520;
        auVar154._8_4_ = local_520;
        auVar154._12_4_ = local_520;
        auVar154._16_4_ = local_520;
        auVar154._20_4_ = local_520;
        auVar154._24_4_ = local_520;
        auVar154._28_4_ = local_520;
        uVar25 = vcmpps_avx512vl(auVar154,local_3c0,2);
        uVar147 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
        auVar31._4_4_ = uVar147;
        auVar31._0_4_ = uVar147;
        auVar31._8_4_ = uVar147;
        auVar31._12_4_ = uVar147;
        auVar31._16_4_ = uVar147;
        auVar31._20_4_ = uVar147;
        auVar31._24_4_ = uVar147;
        auVar31._28_4_ = uVar147;
        uVar26 = vcmpps_avx512vl(local_3c0,auVar31,2);
        bVar81 = (byte)uVar25 & (byte)uVar26 & bVar81;
        if (bVar81 != 0) {
          uVar78 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar78 = bVar81 & uVar78;
          if ((char)uVar78 != '\0') {
            fVar176 = auVar100._0_4_ * fVar162;
            fVar190 = auVar100._4_4_ * fVar163;
            auVar40._4_4_ = fVar190;
            auVar40._0_4_ = fVar176;
            fVar82 = auVar100._8_4_ * fVar164;
            auVar40._8_4_ = fVar82;
            fVar83 = auVar100._12_4_ * fVar177;
            auVar40._12_4_ = fVar83;
            fVar139 = auVar100._16_4_ * 0.0;
            auVar40._16_4_ = fVar139;
            fVar140 = auVar100._20_4_ * 0.0;
            auVar40._20_4_ = fVar140;
            fVar141 = auVar100._24_4_ * 0.0;
            auVar40._24_4_ = fVar141;
            auVar40._28_4_ = auVar100._28_4_;
            auVar155._8_4_ = 0x3f800000;
            auVar155._0_8_ = 0x3f8000003f800000;
            auVar155._12_4_ = 0x3f800000;
            auVar155._16_4_ = 0x3f800000;
            auVar155._20_4_ = 0x3f800000;
            auVar155._24_4_ = 0x3f800000;
            auVar155._28_4_ = 0x3f800000;
            auVar112 = vsubps_avx(auVar155,auVar40);
            local_400._0_4_ =
                 (float)((uint)(bVar70 & 1) * (int)fVar176 |
                        (uint)!(bool)(bVar70 & 1) * auVar112._0_4_);
            bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
            local_400._4_4_ = (float)((uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar112._4_4_);
            bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
            local_400._8_4_ = (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar112._8_4_);
            bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
            local_400._12_4_ = (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar112._12_4_)
            ;
            bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
            local_400._16_4_ =
                 (float)((uint)bVar13 * (int)fVar139 | (uint)!bVar13 * auVar112._16_4_);
            bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
            local_400._20_4_ =
                 (float)((uint)bVar13 * (int)fVar140 | (uint)!bVar13 * auVar112._20_4_);
            bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
            local_400._24_4_ =
                 (float)((uint)bVar13 * (int)fVar141 | (uint)!bVar13 * auVar112._24_4_);
            bVar13 = SUB81(uVar71 >> 7,0);
            local_400._28_4_ =
                 (float)((uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar112._28_4_);
            auVar112 = vsubps_avx(auVar105,auVar104);
            auVar88 = vfmadd213ps_fma(auVar112,local_400,auVar104);
            uVar147 = *(undefined4 *)((long)pre->ray_space + sVar80 * 4 + -0x20);
            auVar104._4_4_ = uVar147;
            auVar104._0_4_ = uVar147;
            auVar104._8_4_ = uVar147;
            auVar104._12_4_ = uVar147;
            auVar104._16_4_ = uVar147;
            auVar104._20_4_ = uVar147;
            auVar104._24_4_ = uVar147;
            auVar104._28_4_ = uVar147;
            auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                          CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                                   CONCAT44(auVar88._4_4_ +
                                                                            auVar88._4_4_,
                                                                            auVar88._0_4_ +
                                                                            auVar88._0_4_)))),
                                       auVar104);
            uVar27 = vcmpps_avx512vl(local_3c0,auVar112,6);
            uVar78 = uVar78 & uVar27;
            bVar81 = (byte)uVar78;
            if (bVar81 != 0) {
              auVar174._0_4_ = auVar101._0_4_ * fVar162;
              auVar174._4_4_ = auVar101._4_4_ * fVar163;
              auVar174._8_4_ = auVar101._8_4_ * fVar164;
              auVar174._12_4_ = auVar101._12_4_ * fVar177;
              auVar174._16_4_ = auVar101._16_4_ * 0.0;
              auVar174._20_4_ = auVar101._20_4_ * 0.0;
              auVar174._24_4_ = auVar101._24_4_ * 0.0;
              auVar174._28_4_ = 0;
              auVar187._8_4_ = 0x3f800000;
              auVar187._0_8_ = 0x3f8000003f800000;
              auVar187._12_4_ = 0x3f800000;
              auVar187._16_4_ = 0x3f800000;
              auVar187._20_4_ = 0x3f800000;
              auVar187._24_4_ = 0x3f800000;
              auVar187._28_4_ = 0x3f800000;
              auVar112 = vsubps_avx(auVar187,auVar174);
              auVar124._0_4_ =
                   (uint)(bVar70 & 1) * (int)auVar174._0_4_ |
                   (uint)!(bool)(bVar70 & 1) * auVar112._0_4_;
              bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
              auVar124._4_4_ = (uint)bVar13 * (int)auVar174._4_4_ | (uint)!bVar13 * auVar112._4_4_;
              bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
              auVar124._8_4_ = (uint)bVar13 * (int)auVar174._8_4_ | (uint)!bVar13 * auVar112._8_4_;
              bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
              auVar124._12_4_ =
                   (uint)bVar13 * (int)auVar174._12_4_ | (uint)!bVar13 * auVar112._12_4_;
              bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
              auVar124._16_4_ =
                   (uint)bVar13 * (int)auVar174._16_4_ | (uint)!bVar13 * auVar112._16_4_;
              bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
              auVar124._20_4_ =
                   (uint)bVar13 * (int)auVar174._20_4_ | (uint)!bVar13 * auVar112._20_4_;
              bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
              auVar124._24_4_ =
                   (uint)bVar13 * (int)auVar174._24_4_ | (uint)!bVar13 * auVar112._24_4_;
              auVar124._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar112._28_4_;
              auVar105._8_4_ = 0x40000000;
              auVar105._0_8_ = 0x4000000040000000;
              auVar105._12_4_ = 0x40000000;
              auVar105._16_4_ = 0x40000000;
              auVar105._20_4_ = 0x40000000;
              auVar105._24_4_ = 0x40000000;
              auVar105._28_4_ = 0x40000000;
              local_3e0 = vfmsub132ps_avx512vl(auVar124,auVar187,auVar105);
              local_3a0 = 0;
              auVar213 = ZEXT1664(auVar87);
              if ((pGVar76->mask & *(uint *)(ray + sVar80 * 4 + 0x120)) != 0) {
                fVar168 = 1.0 / auVar107._0_4_;
                local_340[0] = fVar168 * (local_400._0_4_ + 0.0);
                local_340[1] = fVar168 * (local_400._4_4_ + 1.0);
                local_340[2] = fVar168 * (local_400._8_4_ + 2.0);
                local_340[3] = fVar168 * (local_400._12_4_ + 3.0);
                fStack_330 = fVar168 * (local_400._16_4_ + 4.0);
                fStack_32c = fVar168 * (local_400._20_4_ + 5.0);
                fStack_328 = fVar168 * (local_400._24_4_ + 6.0);
                fStack_324 = local_400._28_4_ + 7.0;
                local_320 = local_3e0;
                local_300 = local_3c0;
                auVar156._8_4_ = 0x7f800000;
                auVar156._0_8_ = 0x7f8000007f800000;
                auVar156._12_4_ = 0x7f800000;
                auVar156._16_4_ = 0x7f800000;
                auVar156._20_4_ = 0x7f800000;
                auVar156._24_4_ = 0x7f800000;
                auVar156._28_4_ = 0x7f800000;
                auVar112 = vblendmps_avx512vl(auVar156,local_3c0);
                auVar125._0_4_ =
                     (uint)(bVar81 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                auVar125._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                auVar125._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                auVar125._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                auVar125._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                auVar125._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                auVar125._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                bVar13 = SUB81(uVar78 >> 7,0);
                auVar125._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * 0x7f800000;
                auVar112 = vshufps_avx(auVar125,auVar125,0xb1);
                auVar112 = vminps_avx(auVar125,auVar112);
                auVar113 = vshufpd_avx(auVar112,auVar112,5);
                auVar112 = vminps_avx(auVar112,auVar113);
                auVar113 = vpermpd_avx2(auVar112,0x4e);
                auVar112 = vminps_avx(auVar112,auVar113);
                uVar25 = vcmpps_avx512vl(auVar125,auVar112,0);
                uVar72 = (uint)uVar78;
                if ((bVar81 & (byte)uVar25) != 0) {
                  uVar72 = (uint)(bVar81 & (byte)uVar25);
                }
                uVar73 = 0;
                for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                  uVar73 = uVar73 + 1;
                }
                uVar71 = (ulong)uVar73;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_540 = *(float *)(ray + sVar80 * 4 + 0x100);
                  fStack_53c = 0.0;
                  fStack_538 = 0.0;
                  fStack_534 = 0.0;
                  local_5e0 = auVar103;
                  local_5c0 = local_3c0;
                  local_39c = iVar10;
                  local_390 = auVar87;
                  local_380 = uVar24;
                  uStack_378 = uVar28;
                  local_370 = uVar63;
                  uStack_368 = uVar64;
                  local_360 = uVar65;
                  uStack_358 = uVar66;
                  do {
                    local_1e0 = local_340[uVar71];
                    local_1c0 = *(undefined4 *)(local_320 + uVar71 * 4);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                         *(undefined4 *)(local_300 + uVar71 * 4);
                    local_670.context = context->user;
                    fVar162 = 1.0 - local_1e0;
                    fVar168 = fVar162 * fVar162 * -3.0;
                    auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                              ZEXT416((uint)(local_1e0 * fVar162)),
                                              ZEXT416(0xc0000000));
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar162)),
                                              ZEXT416((uint)(local_1e0 * local_1e0)),
                                              ZEXT416(0x40000000));
                    fVar162 = auVar88._0_4_ * 3.0;
                    fVar163 = auVar84._0_4_ * 3.0;
                    fVar164 = local_1e0 * local_1e0 * 3.0;
                    auVar204._0_4_ = fVar164 * local_6d0;
                    auVar204._4_4_ = fVar164 * fStack_6cc;
                    auVar204._8_4_ = fVar164 * fStack_6c8;
                    auVar204._12_4_ = fVar164 * fStack_6c4;
                    auVar152._4_4_ = fVar163;
                    auVar152._0_4_ = fVar163;
                    auVar152._8_4_ = fVar163;
                    auVar152._12_4_ = fVar163;
                    auVar88 = vfmadd132ps_fma(auVar152,auVar204,auVar20);
                    auVar186._4_4_ = fVar162;
                    auVar186._0_4_ = fVar162;
                    auVar186._8_4_ = fVar162;
                    auVar186._12_4_ = fVar162;
                    auVar88 = vfmadd132ps_fma(auVar186,auVar88,auVar21);
                    auVar153._4_4_ = fVar168;
                    auVar153._0_4_ = fVar168;
                    auVar153._8_4_ = fVar168;
                    auVar153._12_4_ = fVar168;
                    auVar88 = vfmadd213ps_fma(auVar153,auVar87,auVar88);
                    local_240 = auVar88._0_4_;
                    auVar103._8_4_ = 1;
                    auVar103._0_8_ = 0x100000001;
                    auVar103._12_4_ = 1;
                    auVar103._16_4_ = 1;
                    auVar103._20_4_ = 1;
                    auVar103._24_4_ = 1;
                    auVar103._28_4_ = 1;
                    local_220 = vpermps_avx2(auVar103,ZEXT1632(auVar88));
                    auVar198 = ZEXT3264(local_220);
                    auVar205._8_4_ = 2;
                    auVar205._0_8_ = 0x200000002;
                    auVar205._12_4_ = 2;
                    auVar207._16_4_ = 2;
                    auVar207._0_16_ = auVar205;
                    auVar207._20_4_ = 2;
                    auVar207._24_4_ = 2;
                    auVar207._28_4_ = 2;
                    auVar208 = ZEXT3264(auVar207);
                    local_200 = vpermps_avx2(auVar207,ZEXT1632(auVar88));
                    iStack_23c = local_240;
                    iStack_238 = local_240;
                    iStack_234 = local_240;
                    iStack_230 = local_240;
                    iStack_22c = local_240;
                    iStack_228 = local_240;
                    iStack_224 = local_240;
                    fStack_1dc = local_1e0;
                    fStack_1d8 = local_1e0;
                    fStack_1d4 = local_1e0;
                    fStack_1d0 = local_1e0;
                    fStack_1cc = local_1e0;
                    fStack_1c8 = local_1e0;
                    fStack_1c4 = local_1e0;
                    uStack_1bc = local_1c0;
                    uStack_1b8 = local_1c0;
                    uStack_1b4 = local_1c0;
                    uStack_1b0 = local_1c0;
                    uStack_1ac = local_1c0;
                    uStack_1a8 = local_1c0;
                    uStack_1a4 = local_1c0;
                    local_1a0 = local_2a0._0_8_;
                    uStack_198 = local_2a0._8_8_;
                    uStack_190 = local_2a0._16_8_;
                    uStack_188 = local_2a0._24_8_;
                    local_180 = local_280;
                    auVar112 = vpcmpeqd_avx2(local_280,local_280);
                    local_628[1] = auVar112;
                    *local_628 = auVar112;
                    local_160 = (local_670.context)->instID[0];
                    uStack_15c = local_160;
                    uStack_158 = local_160;
                    uStack_154 = local_160;
                    uStack_150 = local_160;
                    uStack_14c = local_160;
                    uStack_148 = local_160;
                    uStack_144 = local_160;
                    local_140 = (local_670.context)->instPrimID[0];
                    uStack_13c = local_140;
                    uStack_138 = local_140;
                    uStack_134 = local_140;
                    uStack_130 = local_140;
                    uStack_12c = local_140;
                    uStack_128 = local_140;
                    uStack_124 = local_140;
                    local_620 = local_2c0;
                    local_670.valid = (int *)local_620;
                    local_670.geometryUserPtr = pGVar76->userPtr;
                    local_670.hit = (RTCHitN *)&local_240;
                    local_670.N = 8;
                    local_670.ray = (RTCRayN *)ray;
                    if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar198 = ZEXT1664(local_220._0_16_);
                      auVar208 = ZEXT1664(auVar205);
                      (*pGVar76->intersectionFilterN)(&local_670);
                      auVar216 = ZEXT3264(local_5c0);
                      auVar227 = ZEXT3264(local_5e0);
                      auVar230 = ZEXT3264(local_580);
                      auVar229 = ZEXT3264(local_560);
                      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar228 = ZEXT1664(auVar88);
                      sVar80 = local_630;
                    }
                    if (local_620 == (undefined1  [32])0x0) {
LAB_0183cb84:
                      *(float *)(ray + sVar80 * 4 + 0x100) = local_540;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar198 = ZEXT1664(auVar198._0_16_);
                        auVar208 = ZEXT1664(auVar208._0_16_);
                        (*p_Var12)(&local_670);
                        auVar216 = ZEXT3264(local_5c0);
                        auVar227 = ZEXT3264(local_5e0);
                        auVar230 = ZEXT3264(local_580);
                        auVar229 = ZEXT3264(local_560);
                        auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar228 = ZEXT1664(auVar88);
                        sVar80 = local_630;
                      }
                      if (local_620 == (undefined1  [32])0x0) goto LAB_0183cb84;
                      uVar27 = vptestmd_avx512vl(local_620,local_620);
                      iVar1 = *(int *)(local_670.hit + 4);
                      iVar2 = *(int *)(local_670.hit + 8);
                      iVar58 = *(int *)(local_670.hit + 0xc);
                      iVar59 = *(int *)(local_670.hit + 0x10);
                      iVar60 = *(int *)(local_670.hit + 0x14);
                      iVar61 = *(int *)(local_670.hit + 0x18);
                      iVar62 = *(int *)(local_670.hit + 0x1c);
                      bVar81 = (byte)uVar27;
                      bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                      bVar19 = SUB81(uVar27 >> 7,0);
                      *(uint *)(local_670.ray + 0x180) =
                           (uint)(bVar81 & 1) * *(int *)local_670.hit |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x180);
                      *(uint *)(local_670.ray + 0x184) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
                      *(uint *)(local_670.ray + 0x188) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
                      *(uint *)(local_670.ray + 0x18c) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
                      *(uint *)(local_670.ray + 400) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 400);
                      *(uint *)(local_670.ray + 0x194) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
                      *(uint *)(local_670.ray + 0x198) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
                      *(uint *)(local_670.ray + 0x19c) =
                           (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
                      iVar1 = *(int *)(local_670.hit + 0x24);
                      iVar2 = *(int *)(local_670.hit + 0x28);
                      iVar58 = *(int *)(local_670.hit + 0x2c);
                      iVar59 = *(int *)(local_670.hit + 0x30);
                      iVar60 = *(int *)(local_670.hit + 0x34);
                      iVar61 = *(int *)(local_670.hit + 0x38);
                      iVar62 = *(int *)(local_670.hit + 0x3c);
                      bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                      bVar19 = SUB81(uVar27 >> 7,0);
                      *(uint *)(local_670.ray + 0x1a0) =
                           (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x20) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1a0);
                      *(uint *)(local_670.ray + 0x1a4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
                      *(uint *)(local_670.ray + 0x1a8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
                      *(uint *)(local_670.ray + 0x1ac) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
                      *(uint *)(local_670.ray + 0x1b0) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
                      *(uint *)(local_670.ray + 0x1b4) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
                      *(uint *)(local_670.ray + 0x1b8) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
                      *(uint *)(local_670.ray + 0x1bc) =
                           (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
                      iVar1 = *(int *)(local_670.hit + 0x44);
                      iVar2 = *(int *)(local_670.hit + 0x48);
                      iVar58 = *(int *)(local_670.hit + 0x4c);
                      iVar59 = *(int *)(local_670.hit + 0x50);
                      iVar60 = *(int *)(local_670.hit + 0x54);
                      iVar61 = *(int *)(local_670.hit + 0x58);
                      iVar62 = *(int *)(local_670.hit + 0x5c);
                      bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                      bVar19 = SUB81(uVar27 >> 7,0);
                      *(uint *)(local_670.ray + 0x1c0) =
                           (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x40) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1c0);
                      *(uint *)(local_670.ray + 0x1c4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
                      *(uint *)(local_670.ray + 0x1c8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
                      *(uint *)(local_670.ray + 0x1cc) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
                      *(uint *)(local_670.ray + 0x1d0) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
                      *(uint *)(local_670.ray + 0x1d4) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
                      *(uint *)(local_670.ray + 0x1d8) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
                      *(uint *)(local_670.ray + 0x1dc) =
                           (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
                      iVar1 = *(int *)(local_670.hit + 100);
                      iVar2 = *(int *)(local_670.hit + 0x68);
                      iVar58 = *(int *)(local_670.hit + 0x6c);
                      iVar59 = *(int *)(local_670.hit + 0x70);
                      iVar60 = *(int *)(local_670.hit + 0x74);
                      iVar61 = *(int *)(local_670.hit + 0x78);
                      iVar62 = *(int *)(local_670.hit + 0x7c);
                      bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                      bVar19 = SUB81(uVar27 >> 7,0);
                      *(uint *)(local_670.ray + 0x1e0) =
                           (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x60) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1e0);
                      *(uint *)(local_670.ray + 0x1e4) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
                      *(uint *)(local_670.ray + 0x1e8) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
                      *(uint *)(local_670.ray + 0x1ec) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
                      *(uint *)(local_670.ray + 0x1f0) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
                      *(uint *)(local_670.ray + 500) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 500);
                      *(uint *)(local_670.ray + 0x1f8) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
                      *(uint *)(local_670.ray + 0x1fc) =
                           (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
                      iVar1 = *(int *)(local_670.hit + 0x84);
                      iVar2 = *(int *)(local_670.hit + 0x88);
                      iVar58 = *(int *)(local_670.hit + 0x8c);
                      iVar59 = *(int *)(local_670.hit + 0x90);
                      iVar60 = *(int *)(local_670.hit + 0x94);
                      iVar61 = *(int *)(local_670.hit + 0x98);
                      iVar62 = *(int *)(local_670.hit + 0x9c);
                      bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                      bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                      bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                      bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                      bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                      bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                      bVar19 = SUB81(uVar27 >> 7,0);
                      *(uint *)(local_670.ray + 0x200) =
                           (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x80) |
                           (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x200);
                      *(uint *)(local_670.ray + 0x204) =
                           (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
                      *(uint *)(local_670.ray + 0x208) =
                           (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
                      *(uint *)(local_670.ray + 0x20c) =
                           (uint)bVar15 * iVar58 | (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
                      *(uint *)(local_670.ray + 0x210) =
                           (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
                      *(uint *)(local_670.ray + 0x214) =
                           (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
                      *(uint *)(local_670.ray + 0x218) =
                           (uint)bVar18 * iVar61 | (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
                      *(uint *)(local_670.ray + 0x21c) =
                           (uint)bVar19 * iVar62 | (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
                      auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0));
                      *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar112;
                      auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0));
                      *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar112;
                      auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0));
                      *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar112;
                      auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0x100));
                      *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar112;
                      local_540 = *(float *)(ray + sVar80 * 4 + 0x100);
                      fStack_53c = 0.0;
                      fStack_538 = 0.0;
                      fStack_534 = 0.0;
                    }
                    auVar103 = auVar227._0_32_;
                    bVar81 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar78;
                    auVar160._4_4_ = local_540;
                    auVar160._0_4_ = local_540;
                    auVar160._8_4_ = local_540;
                    auVar160._12_4_ = local_540;
                    auVar160._16_4_ = local_540;
                    auVar160._20_4_ = local_540;
                    auVar160._24_4_ = local_540;
                    auVar160._28_4_ = local_540;
                    uVar25 = vcmpps_avx512vl(auVar216._0_32_,auVar160,2);
                    if ((bVar81 & (byte)uVar25) == 0) goto LAB_0183bac5;
                    bVar81 = bVar81 & (byte)uVar25;
                    uVar78 = (ulong)bVar81;
                    auVar161._8_4_ = 0x7f800000;
                    auVar161._0_8_ = 0x7f8000007f800000;
                    auVar161._12_4_ = 0x7f800000;
                    auVar161._16_4_ = 0x7f800000;
                    auVar161._20_4_ = 0x7f800000;
                    auVar161._24_4_ = 0x7f800000;
                    auVar161._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar161,auVar216._0_32_);
                    auVar138._0_4_ =
                         (uint)(bVar81 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 1 & 1);
                    auVar138._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 2 & 1);
                    auVar138._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 3 & 1);
                    auVar138._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 4 & 1);
                    auVar138._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 5 & 1);
                    auVar138._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar81 >> 6 & 1);
                    auVar138._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar138._28_4_ =
                         (uint)(bVar81 >> 7) * auVar112._28_4_ |
                         (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                    auVar112 = vshufps_avx(auVar138,auVar138,0xb1);
                    auVar112 = vminps_avx(auVar138,auVar112);
                    auVar113 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar113);
                    auVar113 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar113);
                    uVar25 = vcmpps_avx512vl(auVar138,auVar112,0);
                    bVar70 = (byte)uVar25 & bVar81;
                    if (bVar70 != 0) {
                      bVar81 = bVar70;
                    }
                    uVar72 = 0;
                    for (uVar73 = (uint)bVar81; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000
                        ) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar71 = (ulong)uVar72;
                  } while( true );
                }
                fVar168 = local_340[uVar71];
                uVar147 = *(undefined4 *)(local_320 + uVar71 * 4);
                fVar163 = 1.0 - fVar168;
                fVar162 = fVar163 * fVar163 * -3.0;
                auVar198 = ZEXT464((uint)fVar162);
                auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163)),
                                          ZEXT416((uint)(fVar168 * fVar163)),ZEXT416(0xc0000000));
                auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar163)),
                                          ZEXT416((uint)(fVar168 * fVar168)),ZEXT416(0x40000000));
                fVar163 = auVar88._0_4_ * 3.0;
                fVar164 = auVar84._0_4_ * 3.0;
                fVar177 = fVar168 * fVar168 * 3.0;
                auVar200._0_4_ = fVar177 * local_6d0;
                auVar200._4_4_ = fVar177 * fStack_6cc;
                auVar200._8_4_ = fVar177 * fStack_6c8;
                auVar200._12_4_ = fVar177 * fStack_6c4;
                auVar208 = ZEXT1664(auVar200);
                auVar170._4_4_ = fVar164;
                auVar170._0_4_ = fVar164;
                auVar170._8_4_ = fVar164;
                auVar170._12_4_ = fVar164;
                auVar88 = vfmadd132ps_fma(auVar170,auVar200,*pauVar4);
                auVar183._4_4_ = fVar163;
                auVar183._0_4_ = fVar163;
                auVar183._8_4_ = fVar163;
                auVar183._12_4_ = fVar163;
                auVar88 = vfmadd132ps_fma(auVar183,auVar88,*pauVar3);
                auVar171._4_4_ = fVar162;
                auVar171._0_4_ = fVar162;
                auVar171._8_4_ = fVar162;
                auVar171._12_4_ = fVar162;
                auVar88 = vfmadd213ps_fma(auVar171,auVar87,auVar88);
                *(undefined4 *)(ray + sVar80 * 4 + 0x100) = *(undefined4 *)(local_300 + uVar71 * 4);
                *(int *)(ray + sVar80 * 4 + 0x180) = auVar88._0_4_;
                uVar11 = vextractps_avx(auVar88,1);
                *(undefined4 *)(ray + sVar80 * 4 + 0x1a0) = uVar11;
                uVar11 = vextractps_avx(auVar88,2);
                *(undefined4 *)(ray + sVar80 * 4 + 0x1c0) = uVar11;
                *(float *)(ray + sVar80 * 4 + 0x1e0) = fVar168;
                *(undefined4 *)(ray + sVar80 * 4 + 0x200) = uVar147;
                *(uint *)(ray + sVar80 * 4 + 0x220) = uVar9;
                *(uint *)(ray + sVar80 * 4 + 0x240) = uVar8;
                *(uint *)(ray + sVar80 * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + sVar80 * 4 + 0x280) = context->user->instPrimID[0];
LAB_0183bac5:
                auVar213 = ZEXT1664(auVar87);
                fVar168 = (float)local_640._0_4_;
              }
            }
          }
        }
      }
    }
    local_640._0_4_ = fVar168;
    if (8 < iVar10) {
      auVar112 = vpbroadcastd_avx512vl();
      auVar227 = ZEXT3264(auVar112);
      local_540 = (float)local_640._0_4_;
      fStack_53c = (float)local_640._0_4_;
      fStack_538 = (float)local_640._0_4_;
      fStack_534 = (float)local_640._0_4_;
      fStack_530 = (float)local_640._0_4_;
      fStack_52c = (float)local_640._0_4_;
      fStack_528 = (float)local_640._0_4_;
      fStack_524 = (float)local_640._0_4_;
      uStack_51c = local_520;
      uStack_518 = local_520;
      uStack_514 = local_520;
      uStack_510 = local_520;
      uStack_50c = local_520;
      uStack_508 = local_520;
      uStack_504 = local_520;
      local_100 = 1.0 / (float)local_5a0._0_4_;
      fStack_fc = local_100;
      fStack_f8 = local_100;
      fStack_f4 = local_100;
      fStack_f0 = local_100;
      fStack_ec = local_100;
      fStack_e8 = local_100;
      fStack_e4 = local_100;
      lVar75 = 8;
      local_5e0 = auVar103;
LAB_0183bb5a:
      if (lVar75 < lVar74) {
        auVar112 = vpbroadcastd_avx512vl();
        auVar112 = vpor_avx2(auVar112,_DAT_01fb4ba0);
        uVar26 = vpcmpgtd_avx512vl(auVar227._0_32_,auVar112);
        auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar79);
        auVar113 = *(undefined1 (*) [32])(lVar79 + 0x21fb768 + lVar75 * 4);
        auVar110 = *(undefined1 (*) [32])(lVar79 + 0x21fbbec + lVar75 * 4);
        auVar109 = *(undefined1 (*) [32])(lVar79 + 0x21fc070 + lVar75 * 4);
        auVar216._0_4_ = auVar109._0_4_ * (float)local_4e0._0_4_;
        auVar216._4_4_ = auVar109._4_4_ * (float)local_4e0._4_4_;
        auVar216._8_4_ = auVar109._8_4_ * fStack_4d8;
        auVar216._12_4_ = auVar109._12_4_ * fStack_4d4;
        auVar216._16_4_ = auVar109._16_4_ * fStack_4d0;
        auVar216._20_4_ = auVar109._20_4_ * fStack_4cc;
        auVar216._28_36_ = auVar208._28_36_;
        auVar216._24_4_ = auVar109._24_4_ * fStack_4c8;
        auVar208._0_4_ = auVar109._0_4_ * (float)local_500._0_4_;
        auVar208._4_4_ = auVar109._4_4_ * (float)local_500._4_4_;
        auVar208._8_4_ = auVar109._8_4_ * fStack_4f8;
        auVar208._12_4_ = auVar109._12_4_ * fStack_4f4;
        auVar208._16_4_ = auVar109._16_4_ * fStack_4f0;
        auVar208._20_4_ = auVar109._20_4_ * fStack_4ec;
        auVar208._28_36_ = auVar198._28_36_;
        auVar208._24_4_ = auVar109._24_4_ * fStack_4e8;
        auVar96 = vmulps_avx512vl(local_e0,auVar109);
        auVar97 = vfmadd231ps_avx512vl(auVar216._0_32_,auVar110,local_4a0);
        auVar108 = vfmadd231ps_avx512vl(auVar208._0_32_,auVar110,local_4c0);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar110,local_c0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar113,local_460);
        auVar108 = vfmadd231ps_avx512vl(auVar108,auVar113,local_480);
        auVar98 = vfmadd231ps_avx512vl(auVar96,auVar113,local_a0);
        auVar88 = vfmadd231ps_fma(auVar97,auVar112,local_420);
        auVar208 = ZEXT1664(auVar88);
        auVar84 = vfmadd231ps_fma(auVar108,auVar112,local_440);
        auVar198 = ZEXT1664(auVar84);
        auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar79);
        auVar97 = *(undefined1 (*) [32])(lVar79 + 0x21fdb88 + lVar75 * 4);
        auVar101 = vfmadd231ps_avx512vl(auVar98,auVar112,local_80);
        auVar108 = *(undefined1 (*) [32])(lVar79 + 0x21fe00c + lVar75 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar79 + 0x21fe490 + lVar75 * 4);
        auVar214._0_4_ = auVar98._0_4_ * (float)local_4e0._0_4_;
        auVar214._4_4_ = auVar98._4_4_ * (float)local_4e0._4_4_;
        auVar214._8_4_ = auVar98._8_4_ * fStack_4d8;
        auVar214._12_4_ = auVar98._12_4_ * fStack_4d4;
        auVar214._16_4_ = auVar98._16_4_ * fStack_4d0;
        auVar214._20_4_ = auVar98._20_4_ * fStack_4cc;
        auVar214._28_36_ = auVar213._28_36_;
        auVar214._24_4_ = auVar98._24_4_ * fStack_4c8;
        auVar41._4_4_ = auVar98._4_4_ * (float)local_500._4_4_;
        auVar41._0_4_ = auVar98._0_4_ * (float)local_500._0_4_;
        auVar41._8_4_ = auVar98._8_4_ * fStack_4f8;
        auVar41._12_4_ = auVar98._12_4_ * fStack_4f4;
        auVar41._16_4_ = auVar98._16_4_ * fStack_4f0;
        auVar41._20_4_ = auVar98._20_4_ * fStack_4ec;
        auVar41._24_4_ = auVar98._24_4_ * fStack_4e8;
        auVar41._28_4_ = uStack_4e4;
        auVar99 = vmulps_avx512vl(local_e0,auVar98);
        auVar100 = vfmadd231ps_avx512vl(auVar214._0_32_,auVar108,local_4a0);
        auVar102 = vfmadd231ps_avx512vl(auVar41,auVar108,local_4c0);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_c0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_460);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar97,local_480);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_a0);
        auVar20 = vfmadd231ps_fma(auVar100,auVar96,local_420);
        auVar213 = ZEXT1664(auVar20);
        auVar21 = vfmadd231ps_fma(auVar102,auVar96,local_440);
        auVar102 = vfmadd231ps_avx512vl(auVar99,auVar96,local_80);
        auVar103 = vmaxps_avx512vl(auVar101,auVar102);
        auVar99 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar88));
        auVar100 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar84));
        auVar104 = vmulps_avx512vl(ZEXT1632(auVar84),auVar99);
        auVar105 = vmulps_avx512vl(ZEXT1632(auVar88),auVar100);
        auVar104 = vsubps_avx512vl(auVar104,auVar105);
        auVar105 = vmulps_avx512vl(auVar100,auVar100);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar99,auVar99);
        auVar103 = vmulps_avx512vl(auVar103,auVar103);
        auVar103 = vmulps_avx512vl(auVar103,auVar105);
        auVar104 = vmulps_avx512vl(auVar104,auVar104);
        uVar25 = vcmpps_avx512vl(auVar104,auVar103,2);
        bVar81 = (byte)uVar26 & (byte)uVar25;
        if (bVar81 != 0) {
          auVar98 = vmulps_avx512vl(local_260,auVar98);
          auVar108 = vfmadd213ps_avx512vl(auVar108,local_5e0,auVar98);
          local_580 = auVar230._0_32_;
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_580,auVar108);
          local_560 = auVar229._0_32_;
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_560,auVar97);
          auVar109 = vmulps_avx512vl(local_260,auVar109);
          auVar110 = vfmadd213ps_avx512vl(auVar110,local_5e0,auVar109);
          auVar113 = vfmadd213ps_avx512vl(auVar113,local_580,auVar110);
          auVar97 = vfmadd213ps_avx512vl(auVar112,local_560,auVar113);
          auVar112 = *(undefined1 (*) [32])(lVar79 + 0x21fc4f4 + lVar75 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar79 + 0x21fc978 + lVar75 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar79 + 0x21fcdfc + lVar75 * 4);
          auVar109 = *(undefined1 (*) [32])(lVar79 + 0x21fd280 + lVar75 * 4);
          auVar108 = vmulps_avx512vl(_local_4e0,auVar109);
          auVar98 = vmulps_avx512vl(_local_500,auVar109);
          auVar109 = vmulps_avx512vl(local_260,auVar109);
          auVar108 = vfmadd231ps_avx512vl(auVar108,auVar110,local_4a0);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar110,local_4c0);
          auVar94 = vfmadd231ps_fma(auVar109,auVar110,local_5e0);
          auVar110 = vfmadd231ps_avx512vl(auVar108,auVar113,local_460);
          auVar109 = vfmadd231ps_avx512vl(auVar98,auVar113,local_480);
          auVar113 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),local_580,auVar113);
          auVar108 = vfmadd231ps_avx512vl(auVar110,auVar112,local_420);
          auVar109 = vfmadd231ps_avx512vl(auVar109,auVar112,local_440);
          auVar98 = vfmadd231ps_avx512vl(auVar113,local_560,auVar112);
          auVar112 = *(undefined1 (*) [32])(lVar79 + 0x21fe914 + lVar75 * 4);
          auVar113 = *(undefined1 (*) [32])(lVar79 + 0x21ff21c + lVar75 * 4);
          auVar110 = *(undefined1 (*) [32])(lVar79 + 0x21ff6a0 + lVar75 * 4);
          auVar103 = vmulps_avx512vl(_local_4e0,auVar110);
          auVar104 = vmulps_avx512vl(_local_500,auVar110);
          auVar110 = vmulps_avx512vl(local_260,auVar110);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_4a0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_4c0);
          auVar110 = vfmadd231ps_avx512vl(auVar110,local_5e0,auVar113);
          auVar113 = *(undefined1 (*) [32])(lVar79 + 0x21fed98 + lVar75 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar113,local_460);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar113,local_480);
          auVar113 = vfmadd231ps_avx512vl(auVar110,local_580,auVar113);
          auVar110 = vfmadd231ps_avx512vl(auVar103,auVar112,local_420);
          auVar103 = vfmadd231ps_avx512vl(auVar104,auVar112,local_440);
          auVar113 = vfmadd231ps_avx512vl(auVar113,local_560,auVar112);
          auVar104 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar108,auVar104);
          vandps_avx512vl(auVar109,auVar104);
          auVar112 = vmaxps_avx(auVar104,auVar104);
          vandps_avx512vl(auVar98,auVar104);
          auVar112 = vmaxps_avx(auVar112,auVar104);
          auVar68._4_4_ = fStack_53c;
          auVar68._0_4_ = local_540;
          auVar68._8_4_ = fStack_538;
          auVar68._12_4_ = fStack_534;
          auVar68._16_4_ = fStack_530;
          auVar68._20_4_ = fStack_52c;
          auVar68._24_4_ = fStack_528;
          auVar68._28_4_ = fStack_524;
          uVar71 = vcmpps_avx512vl(auVar112,auVar68,1);
          bVar13 = (bool)((byte)uVar71 & 1);
          auVar126._0_4_ = (float)((uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar108._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar108._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar108._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar108._12_4_)
          ;
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar126._16_4_ = (float)((uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar108._16_4_)
          ;
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar126._20_4_ = (float)((uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar108._20_4_)
          ;
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar126._24_4_ = (float)((uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar108._24_4_)
          ;
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar126._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar108._28_4_;
          bVar13 = (bool)((byte)uVar71 & 1);
          auVar127._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar109._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar127._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar109._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar127._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar109._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar127._12_4_ =
               (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar109._12_4_);
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar127._16_4_ =
               (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar109._16_4_);
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar127._20_4_ =
               (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar109._20_4_);
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar127._24_4_ =
               (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar109._24_4_);
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar127._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar109._28_4_;
          vandps_avx512vl(auVar110,auVar104);
          vandps_avx512vl(auVar103,auVar104);
          auVar112 = vmaxps_avx(auVar127,auVar127);
          vandps_avx512vl(auVar113,auVar104);
          auVar112 = vmaxps_avx(auVar112,auVar127);
          uVar71 = vcmpps_avx512vl(auVar112,auVar68,1);
          bVar13 = (bool)((byte)uVar71 & 1);
          auVar128._0_4_ = (uint)bVar13 * auVar99._0_4_ | (uint)!bVar13 * auVar110._0_4_;
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar128._4_4_ = (uint)bVar13 * auVar99._4_4_ | (uint)!bVar13 * auVar110._4_4_;
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar128._8_4_ = (uint)bVar13 * auVar99._8_4_ | (uint)!bVar13 * auVar110._8_4_;
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar128._12_4_ = (uint)bVar13 * auVar99._12_4_ | (uint)!bVar13 * auVar110._12_4_;
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar128._16_4_ = (uint)bVar13 * auVar99._16_4_ | (uint)!bVar13 * auVar110._16_4_;
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar128._20_4_ = (uint)bVar13 * auVar99._20_4_ | (uint)!bVar13 * auVar110._20_4_;
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar128._24_4_ = (uint)bVar13 * auVar99._24_4_ | (uint)!bVar13 * auVar110._24_4_;
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar128._28_4_ = (uint)bVar13 * auVar99._28_4_ | (uint)!bVar13 * auVar110._28_4_;
          bVar13 = (bool)((byte)uVar71 & 1);
          auVar129._0_4_ = (float)((uint)bVar13 * auVar100._0_4_ | (uint)!bVar13 * auVar103._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar129._4_4_ = (float)((uint)bVar13 * auVar100._4_4_ | (uint)!bVar13 * auVar103._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar129._8_4_ = (float)((uint)bVar13 * auVar100._8_4_ | (uint)!bVar13 * auVar103._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar129._12_4_ =
               (float)((uint)bVar13 * auVar100._12_4_ | (uint)!bVar13 * auVar103._12_4_);
          bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar129._16_4_ =
               (float)((uint)bVar13 * auVar100._16_4_ | (uint)!bVar13 * auVar103._16_4_);
          bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar129._20_4_ =
               (float)((uint)bVar13 * auVar100._20_4_ | (uint)!bVar13 * auVar103._20_4_);
          bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar129._24_4_ =
               (float)((uint)bVar13 * auVar100._24_4_ | (uint)!bVar13 * auVar103._24_4_);
          bVar13 = SUB81(uVar71 >> 7,0);
          auVar129._28_4_ = (uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar103._28_4_;
          auVar219._8_4_ = 0x80000000;
          auVar219._0_8_ = 0x8000000080000000;
          auVar219._12_4_ = 0x80000000;
          auVar219._16_4_ = 0x80000000;
          auVar219._20_4_ = 0x80000000;
          auVar219._24_4_ = 0x80000000;
          auVar219._28_4_ = 0x80000000;
          auVar112 = vxorps_avx512vl(auVar128,auVar219);
          auVar95 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
          auVar113 = vfmadd213ps_avx512vl(auVar126,auVar126,ZEXT1632(auVar95));
          auVar94 = vfmadd231ps_fma(auVar113,auVar127,auVar127);
          auVar113 = vrsqrt14ps_avx512vl(ZEXT1632(auVar94));
          auVar226._8_4_ = 0xbf000000;
          auVar226._0_8_ = 0xbf000000bf000000;
          auVar226._12_4_ = 0xbf000000;
          auVar226._16_4_ = 0xbf000000;
          auVar226._20_4_ = 0xbf000000;
          auVar226._24_4_ = 0xbf000000;
          auVar226._28_4_ = 0xbf000000;
          fVar168 = auVar113._0_4_;
          fVar162 = auVar113._4_4_;
          fVar163 = auVar113._8_4_;
          fVar164 = auVar113._12_4_;
          fVar177 = auVar113._16_4_;
          fVar176 = auVar113._20_4_;
          fVar190 = auVar113._24_4_;
          auVar42._4_4_ = fVar162 * fVar162 * fVar162 * auVar94._4_4_ * -0.5;
          auVar42._0_4_ = fVar168 * fVar168 * fVar168 * auVar94._0_4_ * -0.5;
          auVar42._8_4_ = fVar163 * fVar163 * fVar163 * auVar94._8_4_ * -0.5;
          auVar42._12_4_ = fVar164 * fVar164 * fVar164 * auVar94._12_4_ * -0.5;
          auVar42._16_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar42._20_4_ = fVar176 * fVar176 * fVar176 * -0.0;
          auVar42._24_4_ = fVar190 * fVar190 * fVar190 * -0.0;
          auVar42._28_4_ = auVar127._28_4_;
          auVar110 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar113 = vfmadd231ps_avx512vl(auVar42,auVar110,auVar113);
          auVar43._4_4_ = auVar127._4_4_ * auVar113._4_4_;
          auVar43._0_4_ = auVar127._0_4_ * auVar113._0_4_;
          auVar43._8_4_ = auVar127._8_4_ * auVar113._8_4_;
          auVar43._12_4_ = auVar127._12_4_ * auVar113._12_4_;
          auVar43._16_4_ = auVar127._16_4_ * auVar113._16_4_;
          auVar43._20_4_ = auVar127._20_4_ * auVar113._20_4_;
          auVar43._24_4_ = auVar127._24_4_ * auVar113._24_4_;
          auVar43._28_4_ = 0;
          auVar44._4_4_ = auVar113._4_4_ * -auVar126._4_4_;
          auVar44._0_4_ = auVar113._0_4_ * -auVar126._0_4_;
          auVar44._8_4_ = auVar113._8_4_ * -auVar126._8_4_;
          auVar44._12_4_ = auVar113._12_4_ * -auVar126._12_4_;
          auVar44._16_4_ = auVar113._16_4_ * -auVar126._16_4_;
          auVar44._20_4_ = auVar113._20_4_ * -auVar126._20_4_;
          auVar44._24_4_ = auVar113._24_4_ * -auVar126._24_4_;
          auVar44._28_4_ = auVar127._28_4_;
          auVar109 = vmulps_avx512vl(auVar113,ZEXT1632(auVar95));
          auVar98 = ZEXT1632(auVar95);
          auVar113 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar98);
          auVar113 = vfmadd231ps_avx512vl(auVar113,auVar129,auVar129);
          auVar108 = vrsqrt14ps_avx512vl(auVar113);
          auVar113 = vmulps_avx512vl(auVar113,auVar226);
          fVar168 = auVar108._0_4_;
          fVar162 = auVar108._4_4_;
          fVar163 = auVar108._8_4_;
          fVar164 = auVar108._12_4_;
          fVar177 = auVar108._16_4_;
          fVar176 = auVar108._20_4_;
          fVar190 = auVar108._24_4_;
          auVar45._4_4_ = fVar162 * fVar162 * fVar162 * auVar113._4_4_;
          auVar45._0_4_ = fVar168 * fVar168 * fVar168 * auVar113._0_4_;
          auVar45._8_4_ = fVar163 * fVar163 * fVar163 * auVar113._8_4_;
          auVar45._12_4_ = fVar164 * fVar164 * fVar164 * auVar113._12_4_;
          auVar45._16_4_ = fVar177 * fVar177 * fVar177 * auVar113._16_4_;
          auVar45._20_4_ = fVar176 * fVar176 * fVar176 * auVar113._20_4_;
          auVar45._24_4_ = fVar190 * fVar190 * fVar190 * auVar113._24_4_;
          auVar45._28_4_ = auVar113._28_4_;
          auVar113 = vfmadd231ps_avx512vl(auVar45,auVar110,auVar108);
          auVar46._4_4_ = auVar129._4_4_ * auVar113._4_4_;
          auVar46._0_4_ = auVar129._0_4_ * auVar113._0_4_;
          auVar46._8_4_ = auVar129._8_4_ * auVar113._8_4_;
          auVar46._12_4_ = auVar129._12_4_ * auVar113._12_4_;
          auVar46._16_4_ = auVar129._16_4_ * auVar113._16_4_;
          auVar46._20_4_ = auVar129._20_4_ * auVar113._20_4_;
          auVar46._24_4_ = auVar129._24_4_ * auVar113._24_4_;
          auVar46._28_4_ = auVar108._28_4_;
          auVar47._4_4_ = auVar113._4_4_ * auVar112._4_4_;
          auVar47._0_4_ = auVar113._0_4_ * auVar112._0_4_;
          auVar47._8_4_ = auVar113._8_4_ * auVar112._8_4_;
          auVar47._12_4_ = auVar113._12_4_ * auVar112._12_4_;
          auVar47._16_4_ = auVar113._16_4_ * auVar112._16_4_;
          auVar47._20_4_ = auVar113._20_4_ * auVar112._20_4_;
          auVar47._24_4_ = auVar113._24_4_ * auVar112._24_4_;
          auVar47._28_4_ = auVar112._28_4_;
          auVar112 = vmulps_avx512vl(auVar113,auVar98);
          auVar94 = vfmadd213ps_fma(auVar43,auVar101,ZEXT1632(auVar88));
          auVar89 = vfmadd213ps_fma(auVar44,auVar101,ZEXT1632(auVar84));
          auVar110 = vfmadd213ps_avx512vl(auVar109,auVar101,auVar97);
          auVar108 = vfmadd213ps_avx512vl(auVar46,auVar102,ZEXT1632(auVar20));
          auVar93 = vfnmadd213ps_fma(auVar43,auVar101,ZEXT1632(auVar88));
          auVar88 = vfmadd213ps_fma(auVar47,auVar102,ZEXT1632(auVar21));
          auVar91 = vfnmadd213ps_fma(auVar44,auVar101,ZEXT1632(auVar84));
          auVar84 = vfmadd213ps_fma(auVar112,auVar102,auVar96);
          auVar92 = vfnmadd231ps_fma(auVar97,auVar101,auVar109);
          auVar148 = vfnmadd213ps_fma(auVar46,auVar102,ZEXT1632(auVar20));
          auVar149 = vfnmadd213ps_fma(auVar47,auVar102,ZEXT1632(auVar21));
          auVar165 = vfnmadd231ps_fma(auVar96,auVar102,auVar112);
          auVar96 = vsubps_avx512vl(auVar108,ZEXT1632(auVar93));
          auVar112 = vsubps_avx(ZEXT1632(auVar88),ZEXT1632(auVar91));
          auVar113 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar92));
          auVar48._4_4_ = auVar112._4_4_ * auVar92._4_4_;
          auVar48._0_4_ = auVar112._0_4_ * auVar92._0_4_;
          auVar48._8_4_ = auVar112._8_4_ * auVar92._8_4_;
          auVar48._12_4_ = auVar112._12_4_ * auVar92._12_4_;
          auVar48._16_4_ = auVar112._16_4_ * 0.0;
          auVar48._20_4_ = auVar112._20_4_ * 0.0;
          auVar48._24_4_ = auVar112._24_4_ * 0.0;
          auVar48._28_4_ = auVar109._28_4_;
          auVar20 = vfmsub231ps_fma(auVar48,ZEXT1632(auVar91),auVar113);
          auVar49._4_4_ = auVar113._4_4_ * auVar93._4_4_;
          auVar49._0_4_ = auVar113._0_4_ * auVar93._0_4_;
          auVar49._8_4_ = auVar113._8_4_ * auVar93._8_4_;
          auVar49._12_4_ = auVar113._12_4_ * auVar93._12_4_;
          auVar49._16_4_ = auVar113._16_4_ * 0.0;
          auVar49._20_4_ = auVar113._20_4_ * 0.0;
          auVar49._24_4_ = auVar113._24_4_ * 0.0;
          auVar49._28_4_ = auVar113._28_4_;
          auVar21 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar92),auVar96);
          auVar50._4_4_ = auVar91._4_4_ * auVar96._4_4_;
          auVar50._0_4_ = auVar91._0_4_ * auVar96._0_4_;
          auVar50._8_4_ = auVar91._8_4_ * auVar96._8_4_;
          auVar50._12_4_ = auVar91._12_4_ * auVar96._12_4_;
          auVar50._16_4_ = auVar96._16_4_ * 0.0;
          auVar50._20_4_ = auVar96._20_4_ * 0.0;
          auVar50._24_4_ = auVar96._24_4_ * 0.0;
          auVar50._28_4_ = auVar96._28_4_;
          auVar90 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar93),auVar112);
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar98,ZEXT1632(auVar21));
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar98,ZEXT1632(auVar20));
          auVar104 = ZEXT1632(auVar95);
          uVar71 = vcmpps_avx512vl(auVar112,auVar104,2);
          bVar70 = (byte)uVar71;
          fVar139 = (float)((uint)(bVar70 & 1) * auVar94._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar148._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar141 = (float)((uint)bVar13 * auVar94._4_4_ | (uint)!bVar13 * auVar148._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar143 = (float)((uint)bVar13 * auVar94._8_4_ | (uint)!bVar13 * auVar148._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar145 = (float)((uint)bVar13 * auVar94._12_4_ | (uint)!bVar13 * auVar148._12_4_);
          auVar98 = ZEXT1632(CONCAT412(fVar145,CONCAT48(fVar143,CONCAT44(fVar141,fVar139))));
          fVar140 = (float)((uint)(bVar70 & 1) * auVar89._0_4_ |
                           (uint)!(bool)(bVar70 & 1) * auVar149._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          fVar142 = (float)((uint)bVar13 * auVar89._4_4_ | (uint)!bVar13 * auVar149._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          fVar144 = (float)((uint)bVar13 * auVar89._8_4_ | (uint)!bVar13 * auVar149._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          fVar146 = (float)((uint)bVar13 * auVar89._12_4_ | (uint)!bVar13 * auVar149._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar144,CONCAT44(fVar142,fVar140))));
          auVar130._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar165._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar130._4_4_ = (float)((uint)bVar13 * auVar110._4_4_ | (uint)!bVar13 * auVar165._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar130._8_4_ = (float)((uint)bVar13 * auVar110._8_4_ | (uint)!bVar13 * auVar165._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar130._12_4_ =
               (float)((uint)bVar13 * auVar110._12_4_ | (uint)!bVar13 * auVar165._12_4_);
          fVar168 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar110._16_4_);
          auVar130._16_4_ = fVar168;
          fVar163 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar110._20_4_);
          auVar130._20_4_ = fVar163;
          fVar162 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar110._24_4_);
          auVar130._24_4_ = fVar162;
          iVar1 = (uint)(byte)(uVar71 >> 7) * auVar110._28_4_;
          auVar130._28_4_ = iVar1;
          auVar112 = vblendmps_avx512vl(ZEXT1632(auVar93),auVar108);
          auVar131._0_4_ =
               (uint)(bVar70 & 1) * auVar112._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar20._0_4_;
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar131._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar20._4_4_;
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar131._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar20._8_4_;
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar131._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar20._12_4_;
          auVar131._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar112._16_4_;
          auVar131._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar112._20_4_;
          auVar131._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar112._24_4_;
          auVar131._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar112._28_4_;
          auVar112 = vblendmps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar88));
          auVar132._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar112._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar94._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar132._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar94._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar132._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar94._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar132._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar94._12_4_)
          ;
          fVar176 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar112._16_4_);
          auVar132._16_4_ = fVar176;
          fVar177 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar112._20_4_);
          auVar132._20_4_ = fVar177;
          fVar164 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar112._24_4_);
          auVar132._24_4_ = fVar164;
          auVar132._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar112._28_4_;
          auVar112 = vblendmps_avx512vl(ZEXT1632(auVar92),ZEXT1632(auVar84));
          auVar133._0_4_ =
               (float)((uint)(bVar70 & 1) * auVar112._0_4_ |
                      (uint)!(bool)(bVar70 & 1) * auVar89._0_4_);
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar133._4_4_ = (float)((uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * auVar89._4_4_);
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar133._8_4_ = (float)((uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * auVar89._8_4_);
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar133._12_4_ = (float)((uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * auVar89._12_4_)
          ;
          fVar190 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar112._16_4_);
          auVar133._16_4_ = fVar190;
          fVar82 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar112._20_4_);
          auVar133._20_4_ = fVar82;
          fVar83 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar112._24_4_);
          auVar133._24_4_ = fVar83;
          iVar2 = (uint)(byte)(uVar71 >> 7) * auVar112._28_4_;
          auVar133._28_4_ = iVar2;
          auVar134._0_4_ =
               (uint)(bVar70 & 1) * (int)auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar108._0_4_;
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar134._4_4_ = (uint)bVar13 * (int)auVar93._4_4_ | (uint)!bVar13 * auVar108._4_4_;
          bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar134._8_4_ = (uint)bVar13 * (int)auVar93._8_4_ | (uint)!bVar13 * auVar108._8_4_;
          bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar134._12_4_ = (uint)bVar13 * (int)auVar93._12_4_ | (uint)!bVar13 * auVar108._12_4_;
          auVar134._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_;
          auVar134._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_;
          auVar134._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_;
          auVar134._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar108._28_4_;
          bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
          bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar108 = vsubps_avx512vl(auVar134,auVar98);
          auVar113 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar91._12_4_ |
                                                   (uint)!bVar17 * auVar88._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar91._8_4_ |
                                                            (uint)!bVar15 * auVar88._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar91._4_4_ |
                                                                     (uint)!bVar13 * auVar88._4_4_,
                                                                     (uint)(bVar70 & 1) *
                                                                     (int)auVar91._0_4_ |
                                                                     (uint)!(bool)(bVar70 & 1) *
                                                                     auVar88._0_4_)))),auVar99);
          auVar208 = ZEXT3264(auVar113);
          auVar110 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar92._12_4_ |
                                                   (uint)!bVar18 * auVar84._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar92._8_4_ |
                                                            (uint)!bVar16 * auVar84._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar92._4_4_ |
                                                                     (uint)!bVar14 * auVar84._4_4_,
                                                                     (uint)(bVar70 & 1) *
                                                                     (int)auVar92._0_4_ |
                                                                     (uint)!(bool)(bVar70 & 1) *
                                                                     auVar84._0_4_)))),auVar130);
          auVar109 = vsubps_avx(auVar98,auVar131);
          auVar213 = ZEXT3264(auVar109);
          auVar96 = vsubps_avx(auVar99,auVar132);
          auVar97 = vsubps_avx(auVar130,auVar133);
          auVar51._4_4_ = auVar110._4_4_ * fVar141;
          auVar51._0_4_ = auVar110._0_4_ * fVar139;
          auVar51._8_4_ = auVar110._8_4_ * fVar143;
          auVar51._12_4_ = auVar110._12_4_ * fVar145;
          auVar51._16_4_ = auVar110._16_4_ * 0.0;
          auVar51._20_4_ = auVar110._20_4_ * 0.0;
          auVar51._24_4_ = auVar110._24_4_ * 0.0;
          auVar51._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar51,auVar130,auVar108);
          auVar188._0_4_ = fVar140 * auVar108._0_4_;
          auVar188._4_4_ = fVar142 * auVar108._4_4_;
          auVar188._8_4_ = fVar144 * auVar108._8_4_;
          auVar188._12_4_ = fVar146 * auVar108._12_4_;
          auVar188._16_4_ = auVar108._16_4_ * 0.0;
          auVar188._20_4_ = auVar108._20_4_ * 0.0;
          auVar188._24_4_ = auVar108._24_4_ * 0.0;
          auVar188._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar188,auVar98,auVar113);
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar104,ZEXT1632(auVar88));
          auVar195._0_4_ = auVar113._0_4_ * auVar130._0_4_;
          auVar195._4_4_ = auVar113._4_4_ * auVar130._4_4_;
          auVar195._8_4_ = auVar113._8_4_ * auVar130._8_4_;
          auVar195._12_4_ = auVar113._12_4_ * auVar130._12_4_;
          auVar195._16_4_ = auVar113._16_4_ * fVar168;
          auVar195._20_4_ = auVar113._20_4_ * fVar163;
          auVar195._24_4_ = auVar113._24_4_ * fVar162;
          auVar195._28_4_ = 0;
          auVar88 = vfmsub231ps_fma(auVar195,auVar99,auVar110);
          auVar100 = vfmadd231ps_avx512vl(auVar112,auVar104,ZEXT1632(auVar88));
          auVar112 = vmulps_avx512vl(auVar97,auVar131);
          auVar112 = vfmsub231ps_avx512vl(auVar112,auVar109,auVar133);
          auVar52._4_4_ = auVar96._4_4_ * auVar133._4_4_;
          auVar52._0_4_ = auVar96._0_4_ * auVar133._0_4_;
          auVar52._8_4_ = auVar96._8_4_ * auVar133._8_4_;
          auVar52._12_4_ = auVar96._12_4_ * auVar133._12_4_;
          auVar52._16_4_ = auVar96._16_4_ * fVar190;
          auVar52._20_4_ = auVar96._20_4_ * fVar82;
          auVar52._24_4_ = auVar96._24_4_ * fVar83;
          auVar52._28_4_ = iVar2;
          auVar88 = vfmsub231ps_fma(auVar52,auVar132,auVar97);
          auVar196._0_4_ = auVar132._0_4_ * auVar109._0_4_;
          auVar196._4_4_ = auVar132._4_4_ * auVar109._4_4_;
          auVar196._8_4_ = auVar132._8_4_ * auVar109._8_4_;
          auVar196._12_4_ = auVar132._12_4_ * auVar109._12_4_;
          auVar196._16_4_ = fVar176 * auVar109._16_4_;
          auVar196._20_4_ = fVar177 * auVar109._20_4_;
          auVar196._24_4_ = fVar164 * auVar109._24_4_;
          auVar196._28_4_ = 0;
          auVar84 = vfmsub231ps_fma(auVar196,auVar96,auVar131);
          auVar112 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar104,auVar112);
          auVar103 = vfmadd231ps_avx512vl(auVar112,auVar104,ZEXT1632(auVar88));
          auVar198 = ZEXT3264(auVar103);
          auVar112 = vmaxps_avx(auVar100,auVar103);
          uVar25 = vcmpps_avx512vl(auVar112,auVar104,2);
          bVar81 = bVar81 & (byte)uVar25;
          if (bVar81 != 0) {
            auVar53._4_4_ = auVar97._4_4_ * auVar113._4_4_;
            auVar53._0_4_ = auVar97._0_4_ * auVar113._0_4_;
            auVar53._8_4_ = auVar97._8_4_ * auVar113._8_4_;
            auVar53._12_4_ = auVar97._12_4_ * auVar113._12_4_;
            auVar53._16_4_ = auVar97._16_4_ * auVar113._16_4_;
            auVar53._20_4_ = auVar97._20_4_ * auVar113._20_4_;
            auVar53._24_4_ = auVar97._24_4_ * auVar113._24_4_;
            auVar53._28_4_ = auVar112._28_4_;
            auVar21 = vfmsub231ps_fma(auVar53,auVar96,auVar110);
            auVar54._4_4_ = auVar110._4_4_ * auVar109._4_4_;
            auVar54._0_4_ = auVar110._0_4_ * auVar109._0_4_;
            auVar54._8_4_ = auVar110._8_4_ * auVar109._8_4_;
            auVar54._12_4_ = auVar110._12_4_ * auVar109._12_4_;
            auVar54._16_4_ = auVar110._16_4_ * auVar109._16_4_;
            auVar54._20_4_ = auVar110._20_4_ * auVar109._20_4_;
            auVar54._24_4_ = auVar110._24_4_ * auVar109._24_4_;
            auVar54._28_4_ = auVar110._28_4_;
            auVar20 = vfmsub231ps_fma(auVar54,auVar108,auVar97);
            auVar55._4_4_ = auVar96._4_4_ * auVar108._4_4_;
            auVar55._0_4_ = auVar96._0_4_ * auVar108._0_4_;
            auVar55._8_4_ = auVar96._8_4_ * auVar108._8_4_;
            auVar55._12_4_ = auVar96._12_4_ * auVar108._12_4_;
            auVar55._16_4_ = auVar96._16_4_ * auVar108._16_4_;
            auVar55._20_4_ = auVar96._20_4_ * auVar108._20_4_;
            auVar55._24_4_ = auVar96._24_4_ * auVar108._24_4_;
            auVar55._28_4_ = auVar96._28_4_;
            auVar94 = vfmsub231ps_fma(auVar55,auVar109,auVar113);
            auVar88 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar94));
            auVar84 = vfmadd231ps_fma(ZEXT1632(auVar88),ZEXT1632(auVar21),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar112 = vrcp14ps_avx512vl(ZEXT1632(auVar84));
            auVar213 = ZEXT3264(auVar112);
            auVar32._8_4_ = 0x3f800000;
            auVar32._0_8_ = 0x3f8000003f800000;
            auVar32._12_4_ = 0x3f800000;
            auVar32._16_4_ = 0x3f800000;
            auVar32._20_4_ = 0x3f800000;
            auVar32._24_4_ = 0x3f800000;
            auVar32._28_4_ = 0x3f800000;
            auVar113 = vfnmadd213ps_avx512vl(auVar112,ZEXT1632(auVar84),auVar32);
            auVar88 = vfmadd132ps_fma(auVar113,auVar112,auVar112);
            auVar208 = ZEXT1664(auVar88);
            auVar56._4_4_ = auVar94._4_4_ * auVar130._4_4_;
            auVar56._0_4_ = auVar94._0_4_ * auVar130._0_4_;
            auVar56._8_4_ = auVar94._8_4_ * auVar130._8_4_;
            auVar56._12_4_ = auVar94._12_4_ * auVar130._12_4_;
            auVar56._16_4_ = fVar168 * 0.0;
            auVar56._20_4_ = fVar163 * 0.0;
            auVar56._24_4_ = fVar162 * 0.0;
            auVar56._28_4_ = iVar1;
            auVar20 = vfmadd231ps_fma(auVar56,auVar99,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar98,ZEXT1632(auVar21));
            fVar168 = auVar88._0_4_;
            fVar162 = auVar88._4_4_;
            fVar163 = auVar88._8_4_;
            fVar164 = auVar88._12_4_;
            local_3c0 = ZEXT1632(CONCAT412(auVar20._12_4_ * fVar164,
                                           CONCAT48(auVar20._8_4_ * fVar163,
                                                    CONCAT44(auVar20._4_4_ * fVar162,
                                                             auVar20._0_4_ * fVar168))));
            auVar216 = ZEXT3264(local_3c0);
            auVar69._4_4_ = uStack_51c;
            auVar69._0_4_ = local_520;
            auVar69._8_4_ = uStack_518;
            auVar69._12_4_ = uStack_514;
            auVar69._16_4_ = uStack_510;
            auVar69._20_4_ = uStack_50c;
            auVar69._24_4_ = uStack_508;
            auVar69._28_4_ = uStack_504;
            uVar25 = vcmpps_avx512vl(local_3c0,auVar69,0xd);
            uVar147 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
            auVar33._4_4_ = uVar147;
            auVar33._0_4_ = uVar147;
            auVar33._8_4_ = uVar147;
            auVar33._12_4_ = uVar147;
            auVar33._16_4_ = uVar147;
            auVar33._20_4_ = uVar147;
            auVar33._24_4_ = uVar147;
            auVar33._28_4_ = uVar147;
            uVar26 = vcmpps_avx512vl(local_3c0,auVar33,2);
            bVar81 = (byte)uVar25 & (byte)uVar26 & bVar81;
            if (bVar81 != 0) {
              uVar78 = vcmpps_avx512vl(ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar78 = bVar81 & uVar78;
              if ((char)uVar78 != '\0') {
                fVar177 = auVar100._0_4_ * fVar168;
                fVar176 = auVar100._4_4_ * fVar162;
                auVar57._4_4_ = fVar176;
                auVar57._0_4_ = fVar177;
                fVar190 = auVar100._8_4_ * fVar163;
                auVar57._8_4_ = fVar190;
                fVar82 = auVar100._12_4_ * fVar164;
                auVar57._12_4_ = fVar82;
                fVar83 = auVar100._16_4_ * 0.0;
                auVar57._16_4_ = fVar83;
                fVar139 = auVar100._20_4_ * 0.0;
                auVar57._20_4_ = fVar139;
                fVar140 = auVar100._24_4_ * 0.0;
                auVar57._24_4_ = fVar140;
                auVar57._28_4_ = auVar100._28_4_;
                auVar175._8_4_ = 0x3f800000;
                auVar175._0_8_ = 0x3f8000003f800000;
                auVar175._12_4_ = 0x3f800000;
                auVar175._16_4_ = 0x3f800000;
                auVar175._20_4_ = 0x3f800000;
                auVar175._24_4_ = 0x3f800000;
                auVar175._28_4_ = 0x3f800000;
                auVar112 = vsubps_avx(auVar175,auVar57);
                local_400._0_4_ =
                     (float)((uint)(bVar70 & 1) * (int)fVar177 |
                            (uint)!(bool)(bVar70 & 1) * auVar112._0_4_);
                bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
                local_400._4_4_ =
                     (float)((uint)bVar13 * (int)fVar176 | (uint)!bVar13 * auVar112._4_4_);
                bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
                local_400._8_4_ =
                     (float)((uint)bVar13 * (int)fVar190 | (uint)!bVar13 * auVar112._8_4_);
                bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
                local_400._12_4_ =
                     (float)((uint)bVar13 * (int)fVar82 | (uint)!bVar13 * auVar112._12_4_);
                bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
                local_400._16_4_ =
                     (float)((uint)bVar13 * (int)fVar83 | (uint)!bVar13 * auVar112._16_4_);
                bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
                local_400._20_4_ =
                     (float)((uint)bVar13 * (int)fVar139 | (uint)!bVar13 * auVar112._20_4_);
                bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                local_400._24_4_ =
                     (float)((uint)bVar13 * (int)fVar140 | (uint)!bVar13 * auVar112._24_4_);
                bVar13 = SUB81(uVar71 >> 7,0);
                local_400._28_4_ =
                     (float)((uint)bVar13 * auVar100._28_4_ | (uint)!bVar13 * auVar112._28_4_);
                auVar112 = vsubps_avx(auVar102,auVar101);
                auVar88 = vfmadd213ps_fma(auVar112,local_400,auVar101);
                uVar147 = *(undefined4 *)((long)pre->ray_space + sVar80 * 4 + -0x20);
                auVar34._4_4_ = uVar147;
                auVar34._0_4_ = uVar147;
                auVar34._8_4_ = uVar147;
                auVar34._12_4_ = uVar147;
                auVar34._16_4_ = uVar147;
                auVar34._20_4_ = uVar147;
                auVar34._24_4_ = uVar147;
                auVar34._28_4_ = uVar147;
                auVar112 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                              CONCAT48(auVar88._8_4_ + auVar88._8_4_
                                                                       ,CONCAT44(auVar88._4_4_ +
                                                                                 auVar88._4_4_,
                                                                                 auVar88._0_4_ +
                                                                                 auVar88._0_4_)))),
                                           auVar34);
                uVar27 = vcmpps_avx512vl(local_3c0,auVar112,6);
                uVar78 = uVar78 & uVar27;
                bVar81 = (byte)uVar78;
                if (bVar81 != 0) {
                  auVar167._0_4_ = auVar103._0_4_ * fVar168;
                  auVar167._4_4_ = auVar103._4_4_ * fVar162;
                  auVar167._8_4_ = auVar103._8_4_ * fVar163;
                  auVar167._12_4_ = auVar103._12_4_ * fVar164;
                  auVar167._16_4_ = auVar103._16_4_ * 0.0;
                  auVar167._20_4_ = auVar103._20_4_ * 0.0;
                  auVar167._24_4_ = auVar103._24_4_ * 0.0;
                  auVar167._28_4_ = 0;
                  auVar189._8_4_ = 0x3f800000;
                  auVar189._0_8_ = 0x3f8000003f800000;
                  auVar189._12_4_ = 0x3f800000;
                  auVar189._16_4_ = 0x3f800000;
                  auVar189._20_4_ = 0x3f800000;
                  auVar189._24_4_ = 0x3f800000;
                  auVar189._28_4_ = 0x3f800000;
                  auVar112 = vsubps_avx(auVar189,auVar167);
                  auVar135._0_4_ =
                       (uint)(bVar70 & 1) * (int)auVar167._0_4_ |
                       (uint)!(bool)(bVar70 & 1) * auVar112._0_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 1) & 1);
                  auVar135._4_4_ =
                       (uint)bVar13 * (int)auVar167._4_4_ | (uint)!bVar13 * auVar112._4_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 2) & 1);
                  auVar135._8_4_ =
                       (uint)bVar13 * (int)auVar167._8_4_ | (uint)!bVar13 * auVar112._8_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 3) & 1);
                  auVar135._12_4_ =
                       (uint)bVar13 * (int)auVar167._12_4_ | (uint)!bVar13 * auVar112._12_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 4) & 1);
                  auVar135._16_4_ =
                       (uint)bVar13 * (int)auVar167._16_4_ | (uint)!bVar13 * auVar112._16_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 5) & 1);
                  auVar135._20_4_ =
                       (uint)bVar13 * (int)auVar167._20_4_ | (uint)!bVar13 * auVar112._20_4_;
                  bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                  auVar135._24_4_ =
                       (uint)bVar13 * (int)auVar167._24_4_ | (uint)!bVar13 * auVar112._24_4_;
                  auVar135._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar112._28_4_;
                  auVar35._8_4_ = 0x40000000;
                  auVar35._0_8_ = 0x4000000040000000;
                  auVar35._12_4_ = 0x40000000;
                  auVar35._16_4_ = 0x40000000;
                  auVar35._20_4_ = 0x40000000;
                  auVar35._24_4_ = 0x40000000;
                  auVar35._28_4_ = 0x40000000;
                  local_3e0 = vfmsub132ps_avx512vl(auVar135,auVar189,auVar35);
                  local_3a0 = (undefined4)lVar75;
                  auVar213 = ZEXT1664(auVar87);
                  pGVar76 = (context->scene->geometries).items[uVar8].ptr;
                  if ((pGVar76->mask & *(uint *)(ray + sVar80 * 4 + 0x120)) != 0) {
                    auVar88 = vcvtsi2ss_avx512f(auVar95,local_3a0);
                    fVar168 = auVar88._0_4_;
                    local_340[0] = (fVar168 + local_400._0_4_ + 0.0) * local_100;
                    local_340[1] = (fVar168 + local_400._4_4_ + 1.0) * fStack_fc;
                    local_340[2] = (fVar168 + local_400._8_4_ + 2.0) * fStack_f8;
                    local_340[3] = (fVar168 + local_400._12_4_ + 3.0) * fStack_f4;
                    fStack_330 = (fVar168 + local_400._16_4_ + 4.0) * fStack_f0;
                    fStack_32c = (fVar168 + local_400._20_4_ + 5.0) * fStack_ec;
                    fStack_328 = (fVar168 + local_400._24_4_ + 6.0) * fStack_e8;
                    fStack_324 = fVar168 + local_400._28_4_ + 7.0;
                    local_320 = local_3e0;
                    local_300 = local_3c0;
                    auVar157._8_4_ = 0x7f800000;
                    auVar157._0_8_ = 0x7f8000007f800000;
                    auVar157._12_4_ = 0x7f800000;
                    auVar157._16_4_ = 0x7f800000;
                    auVar157._20_4_ = 0x7f800000;
                    auVar157._24_4_ = 0x7f800000;
                    auVar157._28_4_ = 0x7f800000;
                    auVar112 = vblendmps_avx512vl(auVar157,local_3c0);
                    auVar136._0_4_ =
                         (uint)(bVar81 & 1) * auVar112._0_4_ |
                         (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 1) & 1);
                    auVar136._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 2) & 1);
                    auVar136._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 3) & 1);
                    auVar136._12_4_ = (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 4) & 1);
                    auVar136._16_4_ = (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 5) & 1);
                    auVar136._20_4_ = (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)((byte)(uVar78 >> 6) & 1);
                    auVar136._24_4_ = (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = SUB81(uVar78 >> 7,0);
                    auVar136._28_4_ = (uint)bVar13 * auVar112._28_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar112 = vshufps_avx(auVar136,auVar136,0xb1);
                    auVar112 = vminps_avx(auVar136,auVar112);
                    auVar113 = vshufpd_avx(auVar112,auVar112,5);
                    auVar112 = vminps_avx(auVar112,auVar113);
                    auVar113 = vpermpd_avx2(auVar112,0x4e);
                    auVar112 = vminps_avx(auVar112,auVar113);
                    uVar25 = vcmpps_avx512vl(auVar136,auVar112,0);
                    uVar72 = (uint)uVar78;
                    if ((bVar81 & (byte)uVar25) != 0) {
                      uVar72 = (uint)(bVar81 & (byte)uVar25);
                    }
                    uVar73 = 0;
                    for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
                      uVar73 = uVar73 + 1;
                    }
                    uVar71 = (ulong)uVar73;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_120 = vmovdqa64_avx512vl(auVar227._0_32_);
                      local_640 = ZEXT416(*(uint *)(ray + sVar80 * 4 + 0x100));
                      local_5c0._0_8_ = pGVar76;
                      local_5e8 = lVar74;
                      local_5a0 = local_3c0;
                      local_39c = iVar10;
                      local_390 = auVar87;
                      local_380 = uVar24;
                      uStack_378 = uVar28;
                      local_370 = uVar63;
                      uStack_368 = uVar64;
                      local_360 = uVar65;
                      uStack_358 = uVar66;
                      do {
                        local_1e0 = local_340[uVar71];
                        local_1c0 = *(undefined4 *)(local_320 + uVar71 * 4);
                        *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                             *(undefined4 *)(local_300 + uVar71 * 4);
                        local_670.context = context->user;
                        fVar162 = 1.0 - local_1e0;
                        fVar168 = fVar162 * fVar162 * -3.0;
                        auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar162 * fVar162)),
                                                  ZEXT416((uint)(local_1e0 * fVar162)),
                                                  ZEXT416(0xc0000000));
                        auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_1e0 * fVar162)),
                                                  ZEXT416((uint)(local_1e0 * local_1e0)),
                                                  ZEXT416(0x40000000));
                        fVar162 = auVar88._0_4_ * 3.0;
                        fVar163 = auVar84._0_4_ * 3.0;
                        fVar164 = local_1e0 * local_1e0 * 3.0;
                        auVar202._0_4_ = fVar164 * local_6d0;
                        auVar202._4_4_ = fVar164 * fStack_6cc;
                        auVar202._8_4_ = fVar164 * fStack_6c8;
                        auVar202._12_4_ = fVar164 * fStack_6c4;
                        auVar150._4_4_ = fVar163;
                        auVar150._0_4_ = fVar163;
                        auVar150._8_4_ = fVar163;
                        auVar150._12_4_ = fVar163;
                        auVar88 = vfmadd132ps_fma(auVar150,auVar202,auVar23);
                        auVar185._4_4_ = fVar162;
                        auVar185._0_4_ = fVar162;
                        auVar185._8_4_ = fVar162;
                        auVar185._12_4_ = fVar162;
                        auVar88 = vfmadd132ps_fma(auVar185,auVar88,auVar86);
                        auVar151._4_4_ = fVar168;
                        auVar151._0_4_ = fVar168;
                        auVar151._8_4_ = fVar168;
                        auVar151._12_4_ = fVar168;
                        auVar88 = vfmadd213ps_fma(auVar151,auVar87,auVar88);
                        local_240 = auVar88._0_4_;
                        auVar197._8_4_ = 1;
                        auVar197._0_8_ = 0x100000001;
                        auVar197._12_4_ = 1;
                        auVar197._16_4_ = 1;
                        auVar197._20_4_ = 1;
                        auVar197._24_4_ = 1;
                        auVar197._28_4_ = 1;
                        local_220 = vpermps_avx2(auVar197,ZEXT1632(auVar88));
                        auVar198 = ZEXT3264(local_220);
                        auVar203._8_4_ = 2;
                        auVar203._0_8_ = 0x200000002;
                        auVar203._12_4_ = 2;
                        auVar206._16_4_ = 2;
                        auVar206._0_16_ = auVar203;
                        auVar206._20_4_ = 2;
                        auVar206._24_4_ = 2;
                        auVar206._28_4_ = 2;
                        auVar208 = ZEXT3264(auVar206);
                        local_200 = vpermps_avx2(auVar206,ZEXT1632(auVar88));
                        iStack_23c = local_240;
                        iStack_238 = local_240;
                        iStack_234 = local_240;
                        iStack_230 = local_240;
                        iStack_22c = local_240;
                        iStack_228 = local_240;
                        iStack_224 = local_240;
                        fStack_1dc = local_1e0;
                        fStack_1d8 = local_1e0;
                        fStack_1d4 = local_1e0;
                        fStack_1d0 = local_1e0;
                        fStack_1cc = local_1e0;
                        fStack_1c8 = local_1e0;
                        fStack_1c4 = local_1e0;
                        uStack_1bc = local_1c0;
                        uStack_1b8 = local_1c0;
                        uStack_1b4 = local_1c0;
                        uStack_1b0 = local_1c0;
                        uStack_1ac = local_1c0;
                        uStack_1a8 = local_1c0;
                        uStack_1a4 = local_1c0;
                        local_1a0 = local_2a0._0_8_;
                        uStack_198 = local_2a0._8_8_;
                        uStack_190 = local_2a0._16_8_;
                        uStack_188 = local_2a0._24_8_;
                        local_180 = local_280;
                        auVar112 = vpcmpeqd_avx2(local_280,local_280);
                        local_628[1] = auVar112;
                        *local_628 = auVar112;
                        local_160 = (local_670.context)->instID[0];
                        uStack_15c = local_160;
                        uStack_158 = local_160;
                        uStack_154 = local_160;
                        uStack_150 = local_160;
                        uStack_14c = local_160;
                        uStack_148 = local_160;
                        uStack_144 = local_160;
                        local_140 = (local_670.context)->instPrimID[0];
                        uStack_13c = local_140;
                        uStack_138 = local_140;
                        uStack_134 = local_140;
                        uStack_130 = local_140;
                        uStack_12c = local_140;
                        uStack_128 = local_140;
                        uStack_124 = local_140;
                        local_620 = local_2c0;
                        local_670.valid = (int *)local_620;
                        local_670.geometryUserPtr = pGVar76->userPtr;
                        local_670.hit = (RTCHitN *)&local_240;
                        local_670.N = 8;
                        local_670.ray = (RTCRayN *)ray;
                        if (pGVar76->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar198 = ZEXT1664(local_220._0_16_);
                          auVar208 = ZEXT1664(auVar203);
                          (*pGVar76->intersectionFilterN)(&local_670);
                          auVar216 = ZEXT3264(local_5a0);
                          pGVar76 = (Geometry *)local_5c0._0_8_;
                        }
                        if (local_620 == (undefined1  [32])0x0) {
LAB_0183c73a:
                          *(undefined4 *)(ray + sVar80 * 4 + 0x100) = local_640._0_4_;
                        }
                        else {
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar76->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            auVar208 = ZEXT1664(auVar208._0_16_);
                            (*p_Var12)(&local_670);
                            auVar216 = ZEXT3264(local_5a0);
                            pGVar76 = (Geometry *)local_5c0._0_8_;
                          }
                          if (local_620 == (undefined1  [32])0x0) goto LAB_0183c73a;
                          uVar27 = vptestmd_avx512vl(local_620,local_620);
                          iVar1 = *(int *)(local_670.hit + 4);
                          iVar2 = *(int *)(local_670.hit + 8);
                          iVar58 = *(int *)(local_670.hit + 0xc);
                          iVar59 = *(int *)(local_670.hit + 0x10);
                          iVar60 = *(int *)(local_670.hit + 0x14);
                          iVar61 = *(int *)(local_670.hit + 0x18);
                          iVar62 = *(int *)(local_670.hit + 0x1c);
                          bVar81 = (byte)uVar27;
                          bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                          bVar19 = SUB81(uVar27 >> 7,0);
                          *(uint *)(local_670.ray + 0x180) =
                               (uint)(bVar81 & 1) * *(int *)local_670.hit |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x180);
                          *(uint *)(local_670.ray + 0x184) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x184);
                          *(uint *)(local_670.ray + 0x188) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x188);
                          *(uint *)(local_670.ray + 0x18c) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x18c);
                          *(uint *)(local_670.ray + 400) =
                               (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_670.ray + 400)
                          ;
                          *(uint *)(local_670.ray + 0x194) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x194);
                          *(uint *)(local_670.ray + 0x198) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x198);
                          *(uint *)(local_670.ray + 0x19c) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x19c);
                          iVar1 = *(int *)(local_670.hit + 0x24);
                          iVar2 = *(int *)(local_670.hit + 0x28);
                          iVar58 = *(int *)(local_670.hit + 0x2c);
                          iVar59 = *(int *)(local_670.hit + 0x30);
                          iVar60 = *(int *)(local_670.hit + 0x34);
                          iVar61 = *(int *)(local_670.hit + 0x38);
                          iVar62 = *(int *)(local_670.hit + 0x3c);
                          bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                          bVar19 = SUB81(uVar27 >> 7,0);
                          *(uint *)(local_670.ray + 0x1a0) =
                               (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x20) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1a0);
                          *(uint *)(local_670.ray + 0x1a4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1a4);
                          *(uint *)(local_670.ray + 0x1a8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1a8);
                          *(uint *)(local_670.ray + 0x1ac) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1ac);
                          *(uint *)(local_670.ray + 0x1b0) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1b0);
                          *(uint *)(local_670.ray + 0x1b4) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1b4);
                          *(uint *)(local_670.ray + 0x1b8) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1b8);
                          *(uint *)(local_670.ray + 0x1bc) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1bc);
                          iVar1 = *(int *)(local_670.hit + 0x44);
                          iVar2 = *(int *)(local_670.hit + 0x48);
                          iVar58 = *(int *)(local_670.hit + 0x4c);
                          iVar59 = *(int *)(local_670.hit + 0x50);
                          iVar60 = *(int *)(local_670.hit + 0x54);
                          iVar61 = *(int *)(local_670.hit + 0x58);
                          iVar62 = *(int *)(local_670.hit + 0x5c);
                          bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                          bVar19 = SUB81(uVar27 >> 7,0);
                          *(uint *)(local_670.ray + 0x1c0) =
                               (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x40) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1c0);
                          *(uint *)(local_670.ray + 0x1c4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1c4);
                          *(uint *)(local_670.ray + 0x1c8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1c8);
                          *(uint *)(local_670.ray + 0x1cc) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1cc);
                          *(uint *)(local_670.ray + 0x1d0) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1d0);
                          *(uint *)(local_670.ray + 0x1d4) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x1d4);
                          *(uint *)(local_670.ray + 0x1d8) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1d8);
                          *(uint *)(local_670.ray + 0x1dc) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1dc);
                          iVar1 = *(int *)(local_670.hit + 100);
                          iVar2 = *(int *)(local_670.hit + 0x68);
                          iVar58 = *(int *)(local_670.hit + 0x6c);
                          iVar59 = *(int *)(local_670.hit + 0x70);
                          iVar60 = *(int *)(local_670.hit + 0x74);
                          iVar61 = *(int *)(local_670.hit + 0x78);
                          iVar62 = *(int *)(local_670.hit + 0x7c);
                          bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                          bVar19 = SUB81(uVar27 >> 7,0);
                          *(uint *)(local_670.ray + 0x1e0) =
                               (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x60) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x1e0);
                          *(uint *)(local_670.ray + 0x1e4) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x1e4);
                          *(uint *)(local_670.ray + 0x1e8) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x1e8);
                          *(uint *)(local_670.ray + 0x1ec) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x1ec);
                          *(uint *)(local_670.ray + 0x1f0) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x1f0);
                          *(uint *)(local_670.ray + 500) =
                               (uint)bVar17 * iVar60 | (uint)!bVar17 * *(int *)(local_670.ray + 500)
                          ;
                          *(uint *)(local_670.ray + 0x1f8) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x1f8);
                          *(uint *)(local_670.ray + 0x1fc) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x1fc);
                          iVar1 = *(int *)(local_670.hit + 0x84);
                          iVar2 = *(int *)(local_670.hit + 0x88);
                          iVar58 = *(int *)(local_670.hit + 0x8c);
                          iVar59 = *(int *)(local_670.hit + 0x90);
                          iVar60 = *(int *)(local_670.hit + 0x94);
                          iVar61 = *(int *)(local_670.hit + 0x98);
                          iVar62 = *(int *)(local_670.hit + 0x9c);
                          bVar13 = (bool)((byte)(uVar27 >> 1) & 1);
                          bVar14 = (bool)((byte)(uVar27 >> 2) & 1);
                          bVar15 = (bool)((byte)(uVar27 >> 3) & 1);
                          bVar16 = (bool)((byte)(uVar27 >> 4) & 1);
                          bVar17 = (bool)((byte)(uVar27 >> 5) & 1);
                          bVar18 = (bool)((byte)(uVar27 >> 6) & 1);
                          bVar19 = SUB81(uVar27 >> 7,0);
                          *(uint *)(local_670.ray + 0x200) =
                               (uint)(bVar81 & 1) * *(int *)(local_670.hit + 0x80) |
                               (uint)!(bool)(bVar81 & 1) * *(int *)(local_670.ray + 0x200);
                          *(uint *)(local_670.ray + 0x204) =
                               (uint)bVar13 * iVar1 |
                               (uint)!bVar13 * *(int *)(local_670.ray + 0x204);
                          *(uint *)(local_670.ray + 0x208) =
                               (uint)bVar14 * iVar2 |
                               (uint)!bVar14 * *(int *)(local_670.ray + 0x208);
                          *(uint *)(local_670.ray + 0x20c) =
                               (uint)bVar15 * iVar58 |
                               (uint)!bVar15 * *(int *)(local_670.ray + 0x20c);
                          *(uint *)(local_670.ray + 0x210) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_670.ray + 0x210);
                          *(uint *)(local_670.ray + 0x214) =
                               (uint)bVar17 * iVar60 |
                               (uint)!bVar17 * *(int *)(local_670.ray + 0x214);
                          *(uint *)(local_670.ray + 0x218) =
                               (uint)bVar18 * iVar61 |
                               (uint)!bVar18 * *(int *)(local_670.ray + 0x218);
                          *(uint *)(local_670.ray + 0x21c) =
                               (uint)bVar19 * iVar62 |
                               (uint)!bVar19 * *(int *)(local_670.ray + 0x21c);
                          auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xa0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x220) = auVar112;
                          auVar112 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xc0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x240) = auVar112;
                          auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_670.hit + 0xe0)
                                                       );
                          *(undefined1 (*) [32])(local_670.ray + 0x260) = auVar112;
                          auVar112 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                         (local_670.hit + 0x100));
                          *(undefined1 (*) [32])(local_670.ray + 0x280) = auVar112;
                          local_640._0_4_ = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
                          local_640._4_4_ = 0;
                          local_640._8_4_ = 0;
                          local_640._12_4_ = 0;
                        }
                        auVar213 = ZEXT1664(auVar87);
                        bVar81 = ~(byte)(1 << ((uint)uVar71 & 0x1f)) & (byte)uVar78;
                        auVar158._4_4_ = local_640._0_4_;
                        auVar158._0_4_ = local_640._0_4_;
                        auVar158._8_4_ = local_640._0_4_;
                        auVar158._12_4_ = local_640._0_4_;
                        auVar158._16_4_ = local_640._0_4_;
                        auVar158._20_4_ = local_640._0_4_;
                        auVar158._24_4_ = local_640._0_4_;
                        auVar158._28_4_ = local_640._0_4_;
                        uVar25 = vcmpps_avx512vl(auVar216._0_32_,auVar158,2);
                        if ((bVar81 & (byte)uVar25) == 0) goto LAB_0183c7da;
                        bVar81 = bVar81 & (byte)uVar25;
                        uVar78 = (ulong)bVar81;
                        auVar159._8_4_ = 0x7f800000;
                        auVar159._0_8_ = 0x7f8000007f800000;
                        auVar159._12_4_ = 0x7f800000;
                        auVar159._16_4_ = 0x7f800000;
                        auVar159._20_4_ = 0x7f800000;
                        auVar159._24_4_ = 0x7f800000;
                        auVar159._28_4_ = 0x7f800000;
                        auVar112 = vblendmps_avx512vl(auVar159,auVar216._0_32_);
                        auVar137._0_4_ =
                             (uint)(bVar81 & 1) * auVar112._0_4_ |
                             (uint)!(bool)(bVar81 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 1 & 1);
                        auVar137._4_4_ = (uint)bVar13 * auVar112._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 2 & 1);
                        auVar137._8_4_ = (uint)bVar13 * auVar112._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 3 & 1);
                        auVar137._12_4_ =
                             (uint)bVar13 * auVar112._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 4 & 1);
                        auVar137._16_4_ =
                             (uint)bVar13 * auVar112._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 5 & 1);
                        auVar137._20_4_ =
                             (uint)bVar13 * auVar112._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar81 >> 6 & 1);
                        auVar137._24_4_ =
                             (uint)bVar13 * auVar112._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar137._28_4_ =
                             (uint)(bVar81 >> 7) * auVar112._28_4_ |
                             (uint)!(bool)(bVar81 >> 7) * 0x7f800000;
                        auVar112 = vshufps_avx(auVar137,auVar137,0xb1);
                        auVar112 = vminps_avx(auVar137,auVar112);
                        auVar113 = vshufpd_avx(auVar112,auVar112,5);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        auVar113 = vpermpd_avx2(auVar112,0x4e);
                        auVar112 = vminps_avx(auVar112,auVar113);
                        uVar25 = vcmpps_avx512vl(auVar137,auVar112,0);
                        bVar70 = (byte)uVar25 & bVar81;
                        if (bVar70 != 0) {
                          bVar81 = bVar70;
                        }
                        uVar72 = 0;
                        for (uVar73 = (uint)bVar81; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x80000000) {
                          uVar72 = uVar72 + 1;
                        }
                        uVar71 = (ulong)uVar72;
                      } while( true );
                    }
                    fVar168 = local_340[uVar71];
                    uVar147 = *(undefined4 *)(local_320 + uVar71 * 4);
                    fVar163 = 1.0 - fVar168;
                    fVar162 = fVar163 * fVar163 * -3.0;
                    auVar198 = ZEXT464((uint)fVar162);
                    auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar163 * fVar163)),
                                              ZEXT416((uint)(fVar168 * fVar163)),ZEXT416(0xc0000000)
                                             );
                    auVar84 = vfmsub132ss_fma(ZEXT416((uint)(fVar168 * fVar163)),
                                              ZEXT416((uint)(fVar168 * fVar168)),ZEXT416(0x40000000)
                                             );
                    fVar163 = auVar88._0_4_ * 3.0;
                    fVar164 = auVar84._0_4_ * 3.0;
                    fVar177 = fVar168 * fVar168 * 3.0;
                    auVar201._0_4_ = fVar177 * local_6d0;
                    auVar201._4_4_ = fVar177 * fStack_6cc;
                    auVar201._8_4_ = fVar177 * fStack_6c8;
                    auVar201._12_4_ = fVar177 * fStack_6c4;
                    auVar208 = ZEXT1664(auVar201);
                    auVar172._4_4_ = fVar164;
                    auVar172._0_4_ = fVar164;
                    auVar172._8_4_ = fVar164;
                    auVar172._12_4_ = fVar164;
                    auVar88 = vfmadd132ps_fma(auVar172,auVar201,auVar85);
                    auVar184._4_4_ = fVar163;
                    auVar184._0_4_ = fVar163;
                    auVar184._8_4_ = fVar163;
                    auVar184._12_4_ = fVar163;
                    auVar88 = vfmadd132ps_fma(auVar184,auVar88,auVar22);
                    auVar173._4_4_ = fVar162;
                    auVar173._0_4_ = fVar162;
                    auVar173._8_4_ = fVar162;
                    auVar173._12_4_ = fVar162;
                    auVar88 = vfmadd213ps_fma(auVar173,auVar87,auVar88);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x100) =
                         *(undefined4 *)(local_300 + uVar71 * 4);
                    *(int *)(ray + sVar80 * 4 + 0x180) = auVar88._0_4_;
                    uVar11 = vextractps_avx(auVar88,1);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x1a0) = uVar11;
                    uVar11 = vextractps_avx(auVar88,2);
                    *(undefined4 *)(ray + sVar80 * 4 + 0x1c0) = uVar11;
                    *(float *)(ray + sVar80 * 4 + 0x1e0) = fVar168;
                    *(undefined4 *)(ray + sVar80 * 4 + 0x200) = uVar147;
                    *(uint *)(ray + sVar80 * 4 + 0x220) = uVar9;
                    *(uint *)(ray + sVar80 * 4 + 0x240) = uVar8;
                    *(uint *)(ray + sVar80 * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + sVar80 * 4 + 0x280) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_0183c3f8;
      }
    }
    uVar147 = *(undefined4 *)(ray + sVar80 * 4 + 0x100);
    auVar29._4_4_ = uVar147;
    auVar29._0_4_ = uVar147;
    auVar29._8_4_ = uVar147;
    auVar29._12_4_ = uVar147;
    uVar24 = vcmpps_avx512vl(local_2d0,auVar29,2);
    uVar77 = (ulong)((uint)uVar77 & (uint)uVar24);
  } while( true );
LAB_0183c7da:
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar228 = ZEXT1664(auVar88);
  auVar229 = ZEXT3264(local_560);
  auVar230 = ZEXT3264(local_580);
  auVar112 = vmovdqa64_avx512vl(local_120);
  auVar227 = ZEXT3264(auVar112);
  lVar74 = local_5e8;
LAB_0183c3f8:
  lVar75 = lVar75 + 8;
  goto LAB_0183bb5a;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }